

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  float fVar93;
  undefined4 uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float t1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 b0;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vfloat4 b0_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  vfloat4 a0_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar217;
  float fVar218;
  vfloat4 a0;
  undefined1 auVar210 [16];
  float fVar219;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  vfloat4 a0_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  RTCFilterFunctionNArguments local_288;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar28;
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar228 [32];
  
  PVar4 = prim[1];
  uVar34 = (ulong)(byte)PVar4;
  fVar208 = *(float *)(prim + uVar34 * 0x19 + 0x12);
  auVar75._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar34 * 0x19 + 6));
  fVar111 = fVar208 * auVar75._16_4_;
  fVar93 = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar34 * 4 + 6);
  auVar62 = vpmovsxbd_avx2(auVar39);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar34 * 5 + 6);
  auVar60 = vpmovsxbd_avx2(auVar52);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar34 * 6 + 6);
  auVar67 = vpmovsxbd_avx2(auVar51);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar34 * 0xb + 6);
  auVar77 = vpmovsxbd_avx2(auVar50);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar71 = vpmovsxbd_avx2(auVar49);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar71);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar34 + 6);
  auVar61 = vpmovsxbd_avx2(auVar48);
  auVar61 = vcvtdq2ps_avx(auVar61);
  uVar33 = (ulong)(uint)((int)(uVar34 * 9) * 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar68 = vpmovsxbd_avx2(auVar47);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar33 + uVar34 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar27 = (ulong)(uint)((int)(uVar34 * 5) << 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar27 + 6);
  auVar59 = vpmovsxbd_avx2(auVar42);
  auVar70 = vcvtdq2ps_avx(auVar59);
  auVar223._4_4_ = fVar93;
  auVar223._0_4_ = fVar93;
  auVar223._8_4_ = fVar93;
  auVar223._12_4_ = fVar93;
  auVar223._16_4_ = fVar93;
  auVar223._20_4_ = fVar93;
  auVar223._24_4_ = fVar93;
  auVar223._28_4_ = fVar93;
  auVar233._8_4_ = 1;
  auVar233._0_8_ = 0x100000001;
  auVar233._12_4_ = 1;
  auVar233._16_4_ = 1;
  auVar233._20_4_ = 1;
  auVar233._24_4_ = 1;
  auVar233._28_4_ = 1;
  auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar73 = ZEXT1632(CONCAT412(fVar208 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar208 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar208 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar93))));
  auVar72 = vpermps_avx2(auVar233,auVar73);
  auVar58 = vpermps_avx512vl(auVar57,auVar73);
  fVar93 = auVar58._0_4_;
  fVar201 = auVar58._4_4_;
  auVar73._4_4_ = fVar201 * auVar67._4_4_;
  auVar73._0_4_ = fVar93 * auVar67._0_4_;
  fVar203 = auVar58._8_4_;
  auVar73._8_4_ = fVar203 * auVar67._8_4_;
  fVar205 = auVar58._12_4_;
  auVar73._12_4_ = fVar205 * auVar67._12_4_;
  fVar206 = auVar58._16_4_;
  auVar73._16_4_ = fVar206 * auVar67._16_4_;
  fVar207 = auVar58._20_4_;
  auVar73._20_4_ = fVar207 * auVar67._20_4_;
  fVar99 = auVar58._24_4_;
  auVar73._24_4_ = fVar99 * auVar67._24_4_;
  auVar73._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar61._4_4_ * fVar201;
  auVar71._0_4_ = auVar61._0_4_ * fVar93;
  auVar71._8_4_ = auVar61._8_4_ * fVar203;
  auVar71._12_4_ = auVar61._12_4_ * fVar205;
  auVar71._16_4_ = auVar61._16_4_ * fVar206;
  auVar71._20_4_ = auVar61._20_4_ * fVar207;
  auVar71._24_4_ = auVar61._24_4_ * fVar99;
  auVar71._28_4_ = auVar59._28_4_;
  auVar59._4_4_ = auVar70._4_4_ * fVar201;
  auVar59._0_4_ = auVar70._0_4_ * fVar93;
  auVar59._8_4_ = auVar70._8_4_ * fVar203;
  auVar59._12_4_ = auVar70._12_4_ * fVar205;
  auVar59._16_4_ = auVar70._16_4_ * fVar206;
  auVar59._20_4_ = auVar70._20_4_ * fVar207;
  auVar59._24_4_ = auVar70._24_4_ * fVar99;
  auVar59._28_4_ = auVar58._28_4_;
  auVar39 = vfmadd231ps_fma(auVar73,auVar72,auVar60);
  auVar52 = vfmadd231ps_fma(auVar71,auVar72,auVar78);
  auVar51 = vfmadd231ps_fma(auVar59,auVar69,auVar72);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar223,auVar62);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar223,auVar77);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar68,auVar223);
  auVar224._4_4_ = fVar111;
  auVar224._0_4_ = fVar111;
  auVar224._8_4_ = fVar111;
  auVar224._12_4_ = fVar111;
  auVar224._16_4_ = fVar111;
  auVar224._20_4_ = fVar111;
  auVar224._24_4_ = fVar111;
  auVar224._28_4_ = fVar111;
  auVar59 = ZEXT1632(CONCAT412(fVar208 * auVar75._28_4_,
                               CONCAT48(fVar208 * auVar75._24_4_,
                                        CONCAT44(fVar208 * auVar75._20_4_,fVar111))));
  auVar71 = vpermps_avx2(auVar233,auVar59);
  auVar59 = vpermps_avx512vl(auVar57,auVar59);
  fVar208 = auVar59._0_4_;
  fVar93 = auVar59._4_4_;
  auVar72._4_4_ = fVar93 * auVar67._4_4_;
  auVar72._0_4_ = fVar208 * auVar67._0_4_;
  fVar201 = auVar59._8_4_;
  auVar72._8_4_ = fVar201 * auVar67._8_4_;
  fVar203 = auVar59._12_4_;
  auVar72._12_4_ = fVar203 * auVar67._12_4_;
  fVar205 = auVar59._16_4_;
  auVar72._16_4_ = fVar205 * auVar67._16_4_;
  fVar206 = auVar59._20_4_;
  auVar72._20_4_ = fVar206 * auVar67._20_4_;
  fVar207 = auVar59._24_4_;
  auVar72._24_4_ = fVar207 * auVar67._24_4_;
  auVar72._28_4_ = 1;
  auVar57._4_4_ = auVar61._4_4_ * fVar93;
  auVar57._0_4_ = auVar61._0_4_ * fVar208;
  auVar57._8_4_ = auVar61._8_4_ * fVar201;
  auVar57._12_4_ = auVar61._12_4_ * fVar203;
  auVar57._16_4_ = auVar61._16_4_ * fVar205;
  auVar57._20_4_ = auVar61._20_4_ * fVar206;
  auVar57._24_4_ = auVar61._24_4_ * fVar207;
  auVar57._28_4_ = auVar67._28_4_;
  auVar61._4_4_ = auVar70._4_4_ * fVar93;
  auVar61._0_4_ = auVar70._0_4_ * fVar208;
  auVar61._8_4_ = auVar70._8_4_ * fVar201;
  auVar61._12_4_ = auVar70._12_4_ * fVar203;
  auVar61._16_4_ = auVar70._16_4_ * fVar205;
  auVar61._20_4_ = auVar70._20_4_ * fVar206;
  auVar61._24_4_ = auVar70._24_4_ * fVar207;
  auVar61._28_4_ = auVar59._28_4_;
  auVar50 = vfmadd231ps_fma(auVar72,auVar71,auVar60);
  auVar49 = vfmadd231ps_fma(auVar57,auVar71,auVar78);
  auVar48 = vfmadd231ps_fma(auVar61,auVar71,auVar69);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar224,auVar62);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar224,auVar77);
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81._16_4_ = 0x7fffffff;
  auVar81._20_4_ = 0x7fffffff;
  auVar81._24_4_ = 0x7fffffff;
  auVar81._28_4_ = 0x7fffffff;
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar224,auVar68);
  auVar62 = vandps_avx(ZEXT1632(auVar39),auVar81);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar141._16_4_ = 0x219392ef;
  auVar141._20_4_ = 0x219392ef;
  auVar141._24_4_ = 0x219392ef;
  auVar141._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar62,auVar141,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar58._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._12_4_;
  auVar58._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar58._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar58._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar58._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar52),auVar81);
  uVar33 = vcmpps_avx512vl(auVar62,auVar141,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar74._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar52._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar51),auVar81);
  uVar33 = vcmpps_avx512vl(auVar62,auVar141,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar62._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar51._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar51._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar51._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar51._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar60 = vrcp14ps_avx512vl(auVar58);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar127._16_4_ = 0x3f800000;
  auVar127._20_4_ = 0x3f800000;
  auVar127._24_4_ = 0x3f800000;
  auVar127._28_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar58,auVar60,auVar127);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar74);
  auVar52 = vfnmadd213ps_fma(auVar74,auVar60,auVar127);
  auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar62);
  auVar51 = vfnmadd213ps_fma(auVar62,auVar60,auVar127);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar60,auVar60);
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 7 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar50));
  auVar68._4_4_ = auVar39._4_4_ * auVar62._4_4_;
  auVar68._0_4_ = auVar39._0_4_ * auVar62._0_4_;
  auVar68._8_4_ = auVar39._8_4_ * auVar62._8_4_;
  auVar68._12_4_ = auVar39._12_4_ * auVar62._12_4_;
  auVar68._16_4_ = auVar62._16_4_ * 0.0;
  auVar68._20_4_ = auVar62._20_4_ * 0.0;
  auVar68._24_4_ = auVar62._24_4_ * 0.0;
  auVar68._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 9 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar50));
  auVar61 = vpbroadcastd_avx512vl();
  auVar60 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar80._0_4_ = auVar39._0_4_ * auVar62._0_4_;
  auVar80._4_4_ = auVar39._4_4_ * auVar62._4_4_;
  auVar80._8_4_ = auVar39._8_4_ * auVar62._8_4_;
  auVar80._12_4_ = auVar39._12_4_ * auVar62._12_4_;
  auVar80._16_4_ = auVar62._16_4_ * 0.0;
  auVar80._20_4_ = auVar62._20_4_ * 0.0;
  auVar80._24_4_ = auVar62._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar34 * -2 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar49));
  auVar69._4_4_ = auVar52._4_4_ * auVar62._4_4_;
  auVar69._0_4_ = auVar52._0_4_ * auVar62._0_4_;
  auVar69._8_4_ = auVar52._8_4_ * auVar62._8_4_;
  auVar69._12_4_ = auVar52._12_4_ * auVar62._12_4_;
  auVar69._16_4_ = auVar62._16_4_ * 0.0;
  auVar69._20_4_ = auVar62._20_4_ * 0.0;
  auVar69._24_4_ = auVar62._24_4_ * 0.0;
  auVar69._28_4_ = auVar62._28_4_;
  auVar62 = vcvtdq2ps_avx(auVar60);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar49));
  auVar79._0_4_ = auVar52._0_4_ * auVar62._0_4_;
  auVar79._4_4_ = auVar52._4_4_ * auVar62._4_4_;
  auVar79._8_4_ = auVar52._8_4_ * auVar62._8_4_;
  auVar79._12_4_ = auVar52._12_4_ * auVar62._12_4_;
  auVar79._16_4_ = auVar62._16_4_ * 0.0;
  auVar79._20_4_ = auVar62._20_4_ * 0.0;
  auVar79._24_4_ = auVar62._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 + uVar34 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar48));
  auVar70._4_4_ = auVar62._4_4_ * auVar51._4_4_;
  auVar70._0_4_ = auVar62._0_4_ * auVar51._0_4_;
  auVar70._8_4_ = auVar62._8_4_ * auVar51._8_4_;
  auVar70._12_4_ = auVar62._12_4_ * auVar51._12_4_;
  auVar70._16_4_ = auVar62._16_4_ * 0.0;
  auVar70._20_4_ = auVar62._20_4_ * 0.0;
  auVar70._24_4_ = auVar62._24_4_ * 0.0;
  auVar70._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 0x17 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar48));
  auVar76._0_4_ = auVar51._0_4_ * auVar62._0_4_;
  auVar76._4_4_ = auVar51._4_4_ * auVar62._4_4_;
  auVar76._8_4_ = auVar51._8_4_ * auVar62._8_4_;
  auVar76._12_4_ = auVar51._12_4_ * auVar62._12_4_;
  auVar76._16_4_ = auVar62._16_4_ * 0.0;
  auVar76._20_4_ = auVar62._20_4_ * 0.0;
  auVar76._24_4_ = auVar62._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar62 = vpminsd_avx2(auVar68,auVar80);
  auVar60 = vpminsd_avx2(auVar69,auVar79);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60 = vpminsd_avx2(auVar70,auVar76);
  uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar67._4_4_ = uVar94;
  auVar67._0_4_ = uVar94;
  auVar67._8_4_ = uVar94;
  auVar67._12_4_ = uVar94;
  auVar67._16_4_ = uVar94;
  auVar67._20_4_ = uVar94;
  auVar67._24_4_ = uVar94;
  auVar67._28_4_ = uVar94;
  auVar60 = vmaxps_avx512vl(auVar60,auVar67);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  auVar60._16_4_ = 0x3f7ffffa;
  auVar60._20_4_ = 0x3f7ffffa;
  auVar60._24_4_ = 0x3f7ffffa;
  auVar60._28_4_ = 0x3f7ffffa;
  local_98 = vmulps_avx512vl(auVar62,auVar60);
  auVar62 = vpmaxsd_avx2(auVar68,auVar80);
  auVar60 = vpmaxsd_avx2(auVar69,auVar79);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar60 = vpmaxsd_avx2(auVar70,auVar76);
  fVar208 = (ray->super_RayK<1>).tfar;
  auVar77._4_4_ = fVar208;
  auVar77._0_4_ = fVar208;
  auVar77._8_4_ = fVar208;
  auVar77._12_4_ = fVar208;
  auVar77._16_4_ = fVar208;
  auVar77._20_4_ = fVar208;
  auVar77._24_4_ = fVar208;
  auVar77._28_4_ = fVar208;
  auVar60 = vminps_avx512vl(auVar60,auVar77);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar78._8_4_ = 0x3f800003;
  auVar78._0_8_ = 0x3f8000033f800003;
  auVar78._12_4_ = 0x3f800003;
  auVar78._16_4_ = 0x3f800003;
  auVar78._20_4_ = 0x3f800003;
  auVar78._24_4_ = 0x3f800003;
  auVar78._28_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar78);
  uVar11 = vpcmpgtd_avx512vl(auVar61,_DAT_01fe9900);
  uVar10 = vcmpps_avx512vl(local_98,auVar62,2);
  if ((byte)((byte)uVar10 & (byte)uVar11) != 0) {
    uVar33 = (ulong)(byte)((byte)uVar10 & (byte)uVar11);
    auVar75._16_16_ = auVar62._16_16_;
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar244 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar234 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar235 = ZEXT1664(auVar39);
    auVar243 = ZEXT464(0x3f800000);
    do {
      lVar29 = 0;
      for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar32 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar32].ptr;
      local_300 = (ulong)*(uint *)(prim + lVar29 * 4 + 6);
      uVar27 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar29 * 4 + 6));
      p_Var7 = pGVar6[1].intersectionFilterN;
      pvVar8 = pGVar6[2].userPtr;
      _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar39 = *(undefined1 (*) [16])(_Var9 + uVar27 * (long)pvVar8);
      auVar52 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 1) * (long)pvVar8);
      auVar51 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 2) * (long)pvVar8);
      auVar50 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar27 + 3));
      lVar29 = *(long *)&pGVar6[1].time_range.upper;
      auVar49 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * uVar27);
      auVar48 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 1));
      auVar47 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 2));
      uVar33 = uVar33 - 1 & uVar33;
      auVar46 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 3));
      if (uVar33 != 0) {
        uVar34 = uVar33 - 1 & uVar33;
        for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        }
        if (uVar34 != 0) {
          for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar105 = auVar244._0_16_;
      auVar40 = vmulps_avx512vl(auVar46,auVar105);
      auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar40);
      auVar41._0_4_ = auVar48._0_4_ + auVar42._0_4_;
      auVar41._4_4_ = auVar48._4_4_ + auVar42._4_4_;
      auVar41._8_4_ = auVar48._8_4_ + auVar42._8_4_;
      auVar41._12_4_ = auVar48._12_4_ + auVar42._12_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar105);
      auVar64._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar42 = vmulps_avx512vl(auVar46,auVar64._0_16_);
      auVar55 = auVar234._0_16_;
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar55);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar48,auVar64._0_16_);
      auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar49,auVar55);
      auVar44 = vmulps_avx512vl(auVar50,auVar105);
      auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar51,auVar44);
      auVar210._0_4_ = auVar42._0_4_ + auVar52._0_4_;
      auVar210._4_4_ = auVar42._4_4_ + auVar52._4_4_;
      auVar210._8_4_ = auVar42._8_4_ + auVar52._8_4_;
      auVar210._12_4_ = auVar42._12_4_ + auVar52._12_4_;
      auVar42 = vfmadd231ps_avx512vl(auVar210,auVar39,auVar105);
      auVar45 = vmulps_avx512vl(auVar50,auVar64._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar55);
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar64._0_16_);
      auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar39,auVar55);
      auVar53._0_4_ = auVar47._0_4_ + auVar40._0_4_;
      auVar53._4_4_ = auVar47._4_4_ + auVar40._4_4_;
      auVar53._8_4_ = auVar47._8_4_ + auVar40._8_4_;
      auVar53._12_4_ = auVar47._12_4_ + auVar40._12_4_;
      auVar40 = vfmadd231ps_avx512vl(auVar53,auVar48,auVar64._0_16_);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar49,auVar105);
      auVar46 = vmulps_avx512vl(auVar46,auVar55);
      auVar47 = vfmadd231ps_avx512vl(auVar46,auVar64._0_16_,auVar47);
      auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar55,auVar48);
      auVar47 = vfmadd231ps_avx512vl(auVar48,auVar64._0_16_,auVar49);
      auVar161._0_4_ = auVar44._0_4_ + auVar51._0_4_;
      auVar161._4_4_ = auVar44._4_4_ + auVar51._4_4_;
      auVar161._8_4_ = auVar44._8_4_ + auVar51._8_4_;
      auVar161._12_4_ = auVar44._12_4_ + auVar51._12_4_;
      auVar49 = vfmadd231ps_avx512vl(auVar161,auVar52,auVar64._0_16_);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar39,auVar105);
      auVar50 = vmulps_avx512vl(auVar50,auVar55);
      auVar51 = vfmadd231ps_avx512vl(auVar50,auVar64._0_16_,auVar51);
      auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar55,auVar52);
      auVar48 = vfmadd231ps_avx512vl(auVar52,auVar64._0_16_,auVar39);
      auVar39 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar52 = vshufps_avx(auVar42,auVar42,0xc9);
      fVar205 = auVar43._0_4_;
      auVar129._0_4_ = fVar205 * auVar52._0_4_;
      fVar206 = auVar43._4_4_;
      auVar129._4_4_ = fVar206 * auVar52._4_4_;
      fVar207 = auVar43._8_4_;
      auVar129._8_4_ = fVar207 * auVar52._8_4_;
      fVar99 = auVar43._12_4_;
      auVar129._12_4_ = fVar99 * auVar52._12_4_;
      auVar52 = vfmsub231ps_fma(auVar129,auVar39,auVar42);
      auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar52 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar130._0_4_ = fVar205 * auVar52._0_4_;
      auVar130._4_4_ = fVar206 * auVar52._4_4_;
      auVar130._8_4_ = fVar207 * auVar52._8_4_;
      auVar130._12_4_ = fVar99 * auVar52._12_4_;
      auVar39 = vfmsub231ps_fma(auVar130,auVar39,auVar45);
      auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar52 = vshufps_avx(auVar49,auVar49,0xc9);
      fVar111 = auVar47._0_4_;
      auVar121._0_4_ = fVar111 * auVar52._0_4_;
      fVar118 = auVar47._4_4_;
      auVar121._4_4_ = fVar118 * auVar52._4_4_;
      fVar119 = auVar47._8_4_;
      auVar121._8_4_ = fVar119 * auVar52._8_4_;
      fVar120 = auVar47._12_4_;
      auVar121._12_4_ = fVar120 * auVar52._12_4_;
      auVar52 = vfmsub231ps_fma(auVar121,auVar39,auVar49);
      auVar49 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar52 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar162._0_4_ = auVar52._0_4_ * fVar111;
      auVar162._4_4_ = auVar52._4_4_ * fVar118;
      auVar162._8_4_ = auVar52._8_4_ * fVar119;
      auVar162._12_4_ = auVar52._12_4_ * fVar120;
      auVar52 = vfmsub231ps_fma(auVar162,auVar39,auVar48);
      auVar39 = vdpps_avx(auVar51,auVar51,0x7f);
      auVar48 = vshufps_avx(auVar52,auVar52,0xc9);
      fVar93 = auVar39._0_4_;
      auVar64._16_16_ = auVar75._16_16_;
      auVar63._4_28_ = auVar64._4_28_;
      auVar63._0_4_ = fVar93;
      auVar52 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
      fVar208 = auVar52._0_4_;
      auVar52 = vdpps_avx(auVar51,auVar50,0x7f);
      fVar208 = fVar208 * 1.5 + fVar93 * -0.5 * fVar208 * fVar208 * fVar208;
      fVar189 = fVar208 * auVar51._0_4_;
      fVar200 = fVar208 * auVar51._4_4_;
      fVar202 = fVar208 * auVar51._8_4_;
      fVar204 = fVar208 * auVar51._12_4_;
      auVar170._0_4_ = auVar50._0_4_ * fVar93;
      auVar170._4_4_ = auVar50._4_4_ * fVar93;
      auVar170._8_4_ = auVar50._8_4_ * fVar93;
      auVar170._12_4_ = auVar50._12_4_ * fVar93;
      fVar93 = auVar52._0_4_;
      auVar144._0_4_ = fVar93 * auVar51._0_4_;
      auVar144._4_4_ = fVar93 * auVar51._4_4_;
      auVar144._8_4_ = fVar93 * auVar51._8_4_;
      auVar144._12_4_ = fVar93 * auVar51._12_4_;
      auVar51 = vsubps_avx(auVar170,auVar144);
      auVar52 = vrcp14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar52,ZEXT416(0x40000000));
      fVar201 = auVar52._0_4_ * auVar39._0_4_;
      auVar39 = vdpps_avx(auVar49,auVar49,0x7f);
      fVar203 = auVar39._0_4_;
      auVar66._16_16_ = auVar75._16_16_;
      auVar66._0_16_ = auVar64._0_16_;
      auVar65._4_28_ = auVar66._4_28_;
      auVar65._0_4_ = fVar203;
      auVar52 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
      fVar93 = auVar52._0_4_;
      fVar93 = fVar93 * 1.5 + fVar203 * -0.5 * fVar93 * fVar93 * fVar93;
      auVar52 = vdpps_avx(auVar49,auVar48,0x7f);
      fVar209 = fVar93 * auVar49._0_4_;
      fVar217 = fVar93 * auVar49._4_4_;
      fVar218 = fVar93 * auVar49._8_4_;
      fVar219 = fVar93 * auVar49._12_4_;
      auVar131._0_4_ = fVar203 * auVar48._0_4_;
      auVar131._4_4_ = fVar203 * auVar48._4_4_;
      auVar131._8_4_ = fVar203 * auVar48._8_4_;
      auVar131._12_4_ = fVar203 * auVar48._12_4_;
      fVar203 = auVar52._0_4_;
      auVar122._0_4_ = fVar203 * auVar49._0_4_;
      auVar122._4_4_ = fVar203 * auVar49._4_4_;
      auVar122._8_4_ = fVar203 * auVar49._8_4_;
      auVar122._12_4_ = fVar203 * auVar49._12_4_;
      auVar50 = vsubps_avx(auVar131,auVar122);
      auVar52 = vrcp14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar52,ZEXT416(0x40000000));
      fVar203 = auVar52._0_4_ * auVar39._0_4_;
      auVar39 = vshufps_avx(auVar41,auVar41,0xff);
      auVar151._0_4_ = fVar189 * auVar39._0_4_;
      auVar151._4_4_ = fVar200 * auVar39._4_4_;
      auVar151._8_4_ = fVar202 * auVar39._8_4_;
      auVar151._12_4_ = fVar204 * auVar39._12_4_;
      local_1e8 = vsubps_avx(auVar41,auVar151);
      auVar52 = vshufps_avx(auVar43,auVar43,0xff);
      auVar132._0_4_ = auVar52._0_4_ * fVar189 + auVar39._0_4_ * fVar208 * auVar51._0_4_ * fVar201;
      auVar132._4_4_ = auVar52._4_4_ * fVar200 + auVar39._4_4_ * fVar208 * auVar51._4_4_ * fVar201;
      auVar132._8_4_ = auVar52._8_4_ * fVar202 + auVar39._8_4_ * fVar208 * auVar51._8_4_ * fVar201;
      auVar132._12_4_ =
           auVar52._12_4_ * fVar204 + auVar39._12_4_ * fVar208 * auVar51._12_4_ * fVar201;
      auVar51 = vsubps_avx(auVar43,auVar132);
      local_1f8._0_4_ = auVar41._0_4_ + auVar151._0_4_;
      local_1f8._4_4_ = auVar41._4_4_ + auVar151._4_4_;
      fStack_1f0 = auVar41._8_4_ + auVar151._8_4_;
      fStack_1ec = auVar41._12_4_ + auVar151._12_4_;
      auVar39 = vshufps_avx(auVar40,auVar40,0xff);
      auVar133._0_4_ = fVar209 * auVar39._0_4_;
      auVar133._4_4_ = fVar217 * auVar39._4_4_;
      auVar133._8_4_ = fVar218 * auVar39._8_4_;
      auVar133._12_4_ = fVar219 * auVar39._12_4_;
      local_208 = vsubps_avx(auVar40,auVar133);
      auVar52 = vshufps_avx(auVar47,auVar47,0xff);
      auVar55._0_4_ = fVar209 * auVar52._0_4_ + auVar39._0_4_ * fVar93 * auVar50._0_4_ * fVar203;
      auVar55._4_4_ = fVar217 * auVar52._4_4_ + auVar39._4_4_ * fVar93 * auVar50._4_4_ * fVar203;
      auVar55._8_4_ = fVar218 * auVar52._8_4_ + auVar39._8_4_ * fVar93 * auVar50._8_4_ * fVar203;
      auVar55._12_4_ = fVar219 * auVar52._12_4_ + auVar39._12_4_ * fVar93 * auVar50._12_4_ * fVar203
      ;
      auVar39 = vsubps_avx(auVar47,auVar55);
      _local_218 = vaddps_avx512vl(auVar40,auVar133);
      auVar54._0_4_ = auVar51._0_4_ * 0.33333334;
      auVar54._4_4_ = auVar51._4_4_ * 0.33333334;
      auVar54._8_4_ = auVar51._8_4_ * 0.33333334;
      auVar54._12_4_ = auVar51._12_4_ * 0.33333334;
      local_228 = vaddps_avx512vl(local_1e8,auVar54);
      auVar56._0_4_ = auVar39._0_4_ * 0.33333334;
      auVar56._4_4_ = auVar39._4_4_ * 0.33333334;
      auVar56._8_4_ = auVar39._8_4_ * 0.33333334;
      auVar56._12_4_ = auVar39._12_4_ * 0.33333334;
      local_238 = vsubps_avx512vl(local_208,auVar56);
      auVar43._0_4_ = (fVar205 + auVar132._0_4_) * 0.33333334;
      auVar43._4_4_ = (fVar206 + auVar132._4_4_) * 0.33333334;
      auVar43._8_4_ = (fVar207 + auVar132._8_4_) * 0.33333334;
      auVar43._12_4_ = (fVar99 + auVar132._12_4_) * 0.33333334;
      _local_248 = vaddps_avx512vl(_local_1f8,auVar43);
      auVar44._0_4_ = (fVar111 + auVar55._0_4_) * 0.33333334;
      auVar44._4_4_ = (fVar118 + auVar55._4_4_) * 0.33333334;
      auVar44._8_4_ = (fVar119 + auVar55._8_4_) * 0.33333334;
      auVar44._12_4_ = (fVar120 + auVar55._12_4_) * 0.33333334;
      aVar1 = (ray->super_RayK<1>).org.field_0;
      _local_258 = vsubps_avx512vl(_local_218,auVar44);
      auVar52 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar100._4_4_ = uVar94;
      auVar100._0_4_ = uVar94;
      auVar100._8_4_ = uVar94;
      auVar100._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      aVar2 = (pre->ray_space).vx.field_0;
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      aVar3 = (pre->ray_space).vy.field_0;
      fVar208 = (pre->ray_space).vz.field_0.m128[0];
      fVar93 = (pre->ray_space).vz.field_0.m128[1];
      fVar201 = (pre->ray_space).vz.field_0.m128[2];
      fVar203 = (pre->ray_space).vz.field_0.m128[3];
      auVar45._0_4_ = fVar208 * auVar52._0_4_;
      auVar45._4_4_ = fVar93 * auVar52._4_4_;
      auVar45._8_4_ = fVar201 * auVar52._8_4_;
      auVar45._12_4_ = fVar203 * auVar52._12_4_;
      auVar39 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar39);
      auVar49 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar100);
      auVar52 = vsubps_avx512vl(local_228,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar103._4_4_ = uVar94;
      auVar103._0_4_ = uVar94;
      auVar103._8_4_ = uVar94;
      auVar103._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar101._0_4_ = fVar208 * auVar52._0_4_;
      auVar101._4_4_ = fVar93 * auVar52._4_4_;
      auVar101._8_4_ = fVar201 * auVar52._8_4_;
      auVar101._12_4_ = fVar203 * auVar52._12_4_;
      auVar39 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar39);
      auVar48 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar103);
      auVar52 = vsubps_avx512vl(local_238,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar152._4_4_ = uVar94;
      auVar152._0_4_ = uVar94;
      auVar152._8_4_ = uVar94;
      auVar152._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar104._0_4_ = fVar208 * auVar52._0_4_;
      auVar104._4_4_ = fVar93 * auVar52._4_4_;
      auVar104._8_4_ = fVar201 * auVar52._8_4_;
      auVar104._12_4_ = fVar203 * auVar52._12_4_;
      auVar39 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar39);
      auVar47 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar152);
      auVar52 = vsubps_avx(local_208,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar163._4_4_ = uVar94;
      auVar163._0_4_ = uVar94;
      auVar163._8_4_ = uVar94;
      auVar163._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar153._0_4_ = fVar208 * auVar52._0_4_;
      auVar153._4_4_ = fVar93 * auVar52._4_4_;
      auVar153._8_4_ = fVar201 * auVar52._8_4_;
      auVar153._12_4_ = fVar203 * auVar52._12_4_;
      auVar39 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar3,auVar39);
      auVar46 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar163);
      auVar52 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar171._4_4_ = uVar94;
      auVar171._0_4_ = uVar94;
      auVar171._8_4_ = uVar94;
      auVar171._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar164._0_4_ = auVar52._0_4_ * fVar208;
      auVar164._4_4_ = auVar52._4_4_ * fVar93;
      auVar164._8_4_ = auVar52._8_4_ * fVar201;
      auVar164._12_4_ = auVar52._12_4_ * fVar203;
      auVar39 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar39);
      auVar42 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar171);
      auVar52 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar182._4_4_ = uVar94;
      auVar182._0_4_ = uVar94;
      auVar182._8_4_ = uVar94;
      auVar182._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar172._0_4_ = auVar52._0_4_ * fVar208;
      auVar172._4_4_ = auVar52._4_4_ * fVar93;
      auVar172._8_4_ = auVar52._8_4_ * fVar201;
      auVar172._12_4_ = auVar52._12_4_ * fVar203;
      auVar39 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar3,auVar39);
      auVar75._16_16_ = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar182);
      auVar52 = vsubps_avx512vl(_local_258,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar190._4_4_ = uVar94;
      auVar190._0_4_ = uVar94;
      auVar190._8_4_ = uVar94;
      auVar190._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar183._0_4_ = auVar52._0_4_ * fVar208;
      auVar183._4_4_ = auVar52._4_4_ * fVar93;
      auVar183._8_4_ = auVar52._8_4_ * fVar201;
      auVar183._12_4_ = auVar52._12_4_ * fVar203;
      auVar39 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar3,auVar39);
      auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar190);
      auVar52 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
      uVar94 = auVar52._0_4_;
      auVar191._4_4_ = uVar94;
      auVar191._0_4_ = uVar94;
      auVar191._8_4_ = uVar94;
      auVar191._12_4_ = uVar94;
      auVar39 = vshufps_avx(auVar52,auVar52,0x55);
      auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
      auVar123._0_4_ = fVar208 * auVar52._0_4_;
      auVar123._4_4_ = fVar93 * auVar52._4_4_;
      auVar123._8_4_ = fVar201 * auVar52._8_4_;
      auVar123._12_4_ = fVar203 * auVar52._12_4_;
      auVar39 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar39);
      auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar191);
      local_298 = vmovlhps_avx(auVar49,auVar42);
      local_1a8 = vmovlhps_avx512f(auVar48,auVar75._16_16_);
      local_1b8 = vmovlhps_avx512f(auVar47,auVar40);
      _local_f8 = vmovlhps_avx512f(auVar46,auVar41);
      auVar39 = vminps_avx512vl(local_298,local_1a8);
      auVar51 = vmaxps_avx512vl(local_298,local_1a8);
      auVar52 = vminps_avx512vl(local_1b8,_local_f8);
      auVar52 = vminps_avx(auVar39,auVar52);
      auVar39 = vmaxps_avx512vl(local_1b8,_local_f8);
      auVar39 = vmaxps_avx(auVar51,auVar39);
      auVar51 = vshufpd_avx(auVar52,auVar52,3);
      auVar50 = vshufpd_avx(auVar39,auVar39,3);
      auVar52 = vminps_avx(auVar52,auVar51);
      auVar39 = vmaxps_avx(auVar39,auVar50);
      auVar52 = vandps_avx512vl(auVar52,auVar235._0_16_);
      auVar39 = vandps_avx512vl(auVar39,auVar235._0_16_);
      auVar39 = vmaxps_avx(auVar52,auVar39);
      auVar52 = vmovshdup_avx(auVar39);
      auVar39 = vmaxss_avx(auVar52,auVar39);
      local_1c8 = vmovddup_avx512vl(auVar49);
      auVar240 = ZEXT1664(local_1c8);
      local_1d8 = vmovddup_avx512vl(auVar48);
      auVar242 = ZEXT1664(local_1d8);
      local_2a8._8_8_ = auVar47._0_8_;
      local_2a8._0_8_ = auVar47._0_8_;
      local_2b8._0_8_ = auVar46._0_8_;
      local_2b8._8_8_ = local_2b8._0_8_;
      register0x00001348 = auVar42._0_8_;
      local_2c8 = auVar42._0_8_;
      register0x00001388 = auVar75._16_8_;
      local_2d8 = auVar75._16_8_;
      register0x00001408 = auVar40._0_8_;
      local_2e8 = auVar40._0_8_;
      register0x00001448 = auVar41._0_8_;
      local_2f8 = auVar41._0_8_;
      local_e8 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
      local_d8 = vbroadcastss_avx512vl(local_e8);
      auVar39 = vxorps_avx512vl(local_d8._0_16_,auVar105);
      local_78 = auVar39._0_4_;
      uStack_74 = local_78;
      uStack_70 = local_78;
      uStack_6c = local_78;
      uStack_68 = local_78;
      uStack_64 = local_78;
      uStack_60 = local_78;
      uStack_5c = local_78;
      local_318 = vsubps_avx512vl(local_1a8,local_298);
      local_108 = vsubps_avx512vl(local_1b8,local_1a8);
      local_118 = vsubps_avx512vl(_local_f8,local_1b8);
      local_128 = vsubps_avx(_local_1f8,local_1e8);
      local_138 = vsubps_avx512vl(_local_248,local_228);
      local_148 = vsubps_avx512vl(_local_258,local_238);
      _local_158 = vsubps_avx512vl(_local_218,local_208);
      uVar27 = 0;
      auVar39 = ZEXT816(0x3f80000000000000);
      auVar40 = auVar39;
LAB_01d2feed:
      auVar52 = vshufps_avx(auVar40,auVar40,0x50);
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = 0x3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar228._16_4_ = 0x3f800000;
      auVar228._0_16_ = auVar225;
      auVar228._20_4_ = 0x3f800000;
      auVar228._24_4_ = 0x3f800000;
      auVar228._28_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar225,auVar52);
      fVar208 = auVar52._0_4_;
      auVar124._0_4_ = local_2c8._0_4_ * fVar208;
      fVar93 = auVar52._4_4_;
      auVar124._4_4_ = local_2c8._4_4_ * fVar93;
      fVar201 = auVar52._8_4_;
      auVar124._8_4_ = local_2c8._8_4_ * fVar201;
      fVar203 = auVar52._12_4_;
      auVar124._12_4_ = local_2c8._12_4_ * fVar203;
      auVar134._0_4_ = local_2d8._0_4_ * fVar208;
      auVar134._4_4_ = local_2d8._4_4_ * fVar93;
      auVar134._8_4_ = local_2d8._8_4_ * fVar201;
      auVar134._12_4_ = local_2d8._12_4_ * fVar203;
      auVar145._0_4_ = local_2e8._0_4_ * fVar208;
      auVar145._4_4_ = local_2e8._4_4_ * fVar93;
      auVar145._8_4_ = local_2e8._8_4_ * fVar201;
      auVar145._12_4_ = local_2e8._12_4_ * fVar203;
      auVar105._0_4_ = local_2f8._0_4_ * fVar208;
      auVar105._4_4_ = local_2f8._4_4_ * fVar93;
      auVar105._8_4_ = local_2f8._8_4_ * fVar201;
      auVar105._12_4_ = local_2f8._12_4_ * fVar203;
      auVar49 = vfmadd231ps_avx512vl(auVar124,auVar51,auVar240._0_16_);
      auVar48 = vfmadd231ps_avx512vl(auVar134,auVar51,auVar242._0_16_);
      auVar50 = vfmadd231ps_fma(auVar145,auVar51,local_2a8);
      auVar51 = vfmadd231ps_fma(auVar105,local_2b8,auVar51);
      auVar52 = vmovshdup_avx(auVar39);
      fVar93 = auVar39._0_4_;
      fVar208 = (auVar52._0_4_ - fVar93) * 0.04761905;
      auVar169._4_4_ = fVar93;
      auVar169._0_4_ = fVar93;
      auVar169._8_4_ = fVar93;
      auVar169._12_4_ = fVar93;
      auVar169._16_4_ = fVar93;
      auVar169._20_4_ = fVar93;
      auVar169._24_4_ = fVar93;
      auVar169._28_4_ = fVar93;
      auVar116._0_8_ = auVar52._0_8_;
      auVar116._8_8_ = auVar116._0_8_;
      auVar116._16_8_ = auVar116._0_8_;
      auVar116._24_8_ = auVar116._0_8_;
      auVar62 = vsubps_avx(auVar116,auVar169);
      uVar94 = auVar49._0_4_;
      auVar117._4_4_ = uVar94;
      auVar117._0_4_ = uVar94;
      auVar117._8_4_ = uVar94;
      auVar117._12_4_ = uVar94;
      auVar117._16_4_ = uVar94;
      auVar117._20_4_ = uVar94;
      auVar117._24_4_ = uVar94;
      auVar117._28_4_ = uVar94;
      auVar186._8_4_ = 1;
      auVar186._0_8_ = 0x100000001;
      auVar186._12_4_ = 1;
      auVar186._16_4_ = 1;
      auVar186._20_4_ = 1;
      auVar186._24_4_ = 1;
      auVar186._28_4_ = 1;
      auVar77 = ZEXT1632(auVar49);
      auVar60 = vpermps_avx2(auVar186,auVar77);
      auVar67 = vbroadcastss_avx512vl(auVar48);
      auVar78 = ZEXT1632(auVar48);
      auVar61 = vpermps_avx512vl(auVar186,auVar78);
      auVar68 = vbroadcastss_avx512vl(auVar50);
      auVar75 = ZEXT1632(auVar50);
      auVar69 = vpermps_avx512vl(auVar186,auVar75);
      auVar70 = vbroadcastss_avx512vl(auVar51);
      auVar74 = ZEXT1632(auVar51);
      auVar71 = vpermps_avx512vl(auVar186,auVar74);
      auVar187._4_4_ = fVar208;
      auVar187._0_4_ = fVar208;
      auVar187._8_4_ = fVar208;
      auVar187._12_4_ = fVar208;
      auVar187._16_4_ = fVar208;
      auVar187._20_4_ = fVar208;
      auVar187._24_4_ = fVar208;
      auVar187._28_4_ = fVar208;
      auVar59 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar72 = vpermps_avx512vl(auVar59,auVar77);
      auVar160._8_4_ = 3;
      auVar160._0_8_ = 0x300000003;
      auVar160._12_4_ = 3;
      auVar160._16_4_ = 3;
      auVar160._20_4_ = 3;
      auVar160._24_4_ = 3;
      auVar160._28_4_ = 3;
      auVar73 = vpermps_avx512vl(auVar160,auVar77);
      auVar57 = vpermps_avx512vl(auVar59,auVar78);
      auVar77 = vpermps_avx2(auVar160,auVar78);
      auVar58 = vpermps_avx512vl(auVar59,auVar75);
      auVar78 = vpermps_avx2(auVar160,auVar75);
      auVar59 = vpermps_avx512vl(auVar59,auVar74);
      auVar74 = vpermps_avx512vl(auVar160,auVar74);
      auVar52 = vfmadd132ps_fma(auVar62,auVar169,_DAT_01faff20);
      auVar62 = vsubps_avx(auVar228,ZEXT1632(auVar52));
      auVar75 = vmulps_avx512vl(auVar67,ZEXT1632(auVar52));
      auVar79 = ZEXT1632(auVar52);
      auVar76 = vmulps_avx512vl(auVar61,auVar79);
      auVar51 = vfmadd231ps_fma(auVar75,auVar62,auVar117);
      auVar50 = vfmadd231ps_fma(auVar76,auVar62,auVar60);
      auVar75 = vmulps_avx512vl(auVar68,auVar79);
      auVar76 = vmulps_avx512vl(auVar69,auVar79);
      auVar67 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar67);
      auVar61 = vfmadd231ps_avx512vl(auVar76,auVar62,auVar61);
      auVar75 = vmulps_avx512vl(auVar70,auVar79);
      auVar76 = ZEXT1632(auVar52);
      auVar71 = vmulps_avx512vl(auVar71,auVar76);
      auVar68 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar68);
      auVar69 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar69);
      fVar201 = auVar52._0_4_;
      fVar203 = auVar52._4_4_;
      auVar18._4_4_ = fVar203 * auVar67._4_4_;
      auVar18._0_4_ = fVar201 * auVar67._0_4_;
      fVar205 = auVar52._8_4_;
      auVar18._8_4_ = fVar205 * auVar67._8_4_;
      fVar206 = auVar52._12_4_;
      auVar18._12_4_ = fVar206 * auVar67._12_4_;
      auVar18._16_4_ = auVar67._16_4_ * 0.0;
      auVar18._20_4_ = auVar67._20_4_ * 0.0;
      auVar18._24_4_ = auVar67._24_4_ * 0.0;
      auVar18._28_4_ = fVar93;
      auVar19._4_4_ = fVar203 * auVar61._4_4_;
      auVar19._0_4_ = fVar201 * auVar61._0_4_;
      auVar19._8_4_ = fVar205 * auVar61._8_4_;
      auVar19._12_4_ = fVar206 * auVar61._12_4_;
      auVar19._16_4_ = auVar61._16_4_ * 0.0;
      auVar19._20_4_ = auVar61._20_4_ * 0.0;
      auVar19._24_4_ = auVar61._24_4_ * 0.0;
      auVar19._28_4_ = auVar60._28_4_;
      auVar51 = vfmadd231ps_fma(auVar18,auVar62,ZEXT1632(auVar51));
      auVar50 = vfmadd231ps_fma(auVar19,auVar62,ZEXT1632(auVar50));
      auVar109._0_4_ = fVar201 * auVar68._0_4_;
      auVar109._4_4_ = fVar203 * auVar68._4_4_;
      auVar109._8_4_ = fVar205 * auVar68._8_4_;
      auVar109._12_4_ = fVar206 * auVar68._12_4_;
      auVar109._16_4_ = auVar68._16_4_ * 0.0;
      auVar109._20_4_ = auVar68._20_4_ * 0.0;
      auVar109._24_4_ = auVar68._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      auVar20._4_4_ = fVar203 * auVar69._4_4_;
      auVar20._0_4_ = fVar201 * auVar69._0_4_;
      auVar20._8_4_ = fVar205 * auVar69._8_4_;
      auVar20._12_4_ = fVar206 * auVar69._12_4_;
      auVar20._16_4_ = auVar69._16_4_ * 0.0;
      auVar20._20_4_ = auVar69._20_4_ * 0.0;
      auVar20._24_4_ = auVar69._24_4_ * 0.0;
      auVar20._28_4_ = auVar68._28_4_;
      auVar49 = vfmadd231ps_fma(auVar109,auVar62,auVar67);
      auVar48 = vfmadd231ps_fma(auVar20,auVar62,auVar61);
      auVar21._28_4_ = auVar61._28_4_;
      auVar21._0_28_ =
           ZEXT1628(CONCAT412(fVar206 * auVar48._12_4_,
                              CONCAT48(fVar205 * auVar48._8_4_,
                                       CONCAT44(fVar203 * auVar48._4_4_,fVar201 * auVar48._0_4_))));
      auVar47 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar206 * auVar49._12_4_,
                                                   CONCAT48(fVar205 * auVar49._8_4_,
                                                            CONCAT44(fVar203 * auVar49._4_4_,
                                                                     fVar201 * auVar49._0_4_)))),
                                auVar62,ZEXT1632(auVar51));
      auVar46 = vfmadd231ps_fma(auVar21,auVar62,ZEXT1632(auVar50));
      auVar60 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar51));
      auVar67 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar50));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar60 = vmulps_avx512vl(auVar60,auVar61);
      auVar67 = vmulps_avx512vl(auVar67,auVar61);
      auVar181._0_4_ = fVar208 * auVar60._0_4_;
      auVar181._4_4_ = fVar208 * auVar60._4_4_;
      auVar181._8_4_ = fVar208 * auVar60._8_4_;
      auVar181._12_4_ = fVar208 * auVar60._12_4_;
      auVar181._16_4_ = fVar208 * auVar60._16_4_;
      auVar181._20_4_ = fVar208 * auVar60._20_4_;
      auVar181._24_4_ = fVar208 * auVar60._24_4_;
      auVar181._28_4_ = 0;
      auVar60 = vmulps_avx512vl(auVar187,auVar67);
      auVar50 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
      auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01feed00,ZEXT1632(auVar50));
      auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01feed00,ZEXT1632(auVar50));
      auVar110._0_4_ = auVar181._0_4_ + auVar47._0_4_;
      auVar110._4_4_ = auVar181._4_4_ + auVar47._4_4_;
      auVar110._8_4_ = auVar181._8_4_ + auVar47._8_4_;
      auVar110._12_4_ = auVar181._12_4_ + auVar47._12_4_;
      auVar110._16_4_ = auVar181._16_4_ + 0.0;
      auVar110._20_4_ = auVar181._20_4_ + 0.0;
      auVar110._24_4_ = auVar181._24_4_ + 0.0;
      auVar110._28_4_ = 0;
      auVar79 = ZEXT1632(auVar50);
      auVar69 = vpermt2ps_avx512vl(auVar181,_DAT_01feed00,auVar79);
      auVar70 = vaddps_avx512vl(ZEXT1632(auVar46),auVar60);
      auVar71 = vpermt2ps_avx512vl(auVar60,_DAT_01feed00,auVar79);
      auVar60 = vsubps_avx(auVar67,auVar69);
      auVar69 = vsubps_avx512vl(auVar68,auVar71);
      auVar71 = vmulps_avx512vl(auVar57,auVar76);
      auVar75 = vmulps_avx512vl(auVar77,auVar76);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar72);
      auVar72 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar73);
      auVar73 = vmulps_avx512vl(auVar58,auVar76);
      auVar75 = vmulps_avx512vl(auVar78,auVar76);
      auVar73 = vfmadd231ps_avx512vl(auVar73,auVar62,auVar57);
      auVar77 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar77);
      auVar59 = vmulps_avx512vl(auVar59,auVar76);
      auVar57 = vmulps_avx512vl(auVar74,auVar76);
      auVar51 = vfmadd231ps_fma(auVar59,auVar62,auVar58);
      auVar59 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar78);
      auVar57 = vmulps_avx512vl(auVar76,auVar73);
      auVar74 = ZEXT1632(auVar52);
      auVar58 = vmulps_avx512vl(auVar74,auVar77);
      auVar71 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar71);
      auVar72 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar72);
      auVar59 = vmulps_avx512vl(auVar74,auVar59);
      auVar73 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar206 * auVar51._12_4_,
                                              CONCAT48(fVar205 * auVar51._8_4_,
                                                       CONCAT44(fVar203 * auVar51._4_4_,
                                                                fVar201 * auVar51._0_4_)))),auVar62,
                           auVar73);
      auVar77 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar77);
      auVar22._4_4_ = fVar203 * auVar73._4_4_;
      auVar22._0_4_ = fVar201 * auVar73._0_4_;
      auVar22._8_4_ = fVar205 * auVar73._8_4_;
      auVar22._12_4_ = fVar206 * auVar73._12_4_;
      auVar22._16_4_ = auVar73._16_4_ * 0.0;
      auVar22._20_4_ = auVar73._20_4_ * 0.0;
      auVar22._24_4_ = auVar73._24_4_ * 0.0;
      auVar22._28_4_ = auVar78._28_4_;
      auVar78 = vmulps_avx512vl(auVar74,auVar77);
      auVar59 = vfmadd231ps_avx512vl(auVar22,auVar62,auVar71);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,auVar62);
      auVar62 = vsubps_avx512vl(auVar73,auVar71);
      auVar77 = vsubps_avx512vl(auVar77,auVar72);
      auVar62 = vmulps_avx512vl(auVar62,auVar61);
      auVar77 = vmulps_avx512vl(auVar77,auVar61);
      fVar93 = fVar208 * auVar62._0_4_;
      fVar201 = fVar208 * auVar62._4_4_;
      auVar23._4_4_ = fVar201;
      auVar23._0_4_ = fVar93;
      fVar203 = fVar208 * auVar62._8_4_;
      auVar23._8_4_ = fVar203;
      fVar205 = fVar208 * auVar62._12_4_;
      auVar23._12_4_ = fVar205;
      fVar206 = fVar208 * auVar62._16_4_;
      auVar23._16_4_ = fVar206;
      fVar207 = fVar208 * auVar62._20_4_;
      auVar23._20_4_ = fVar207;
      fVar208 = fVar208 * auVar62._24_4_;
      auVar23._24_4_ = fVar208;
      auVar23._28_4_ = auVar62._28_4_;
      auVar77 = vmulps_avx512vl(auVar187,auVar77);
      auVar61 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar79);
      auVar71 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar79);
      auVar188._0_4_ = auVar59._0_4_ + fVar93;
      auVar188._4_4_ = auVar59._4_4_ + fVar201;
      auVar188._8_4_ = auVar59._8_4_ + fVar203;
      auVar188._12_4_ = auVar59._12_4_ + fVar205;
      auVar188._16_4_ = auVar59._16_4_ + fVar206;
      auVar188._20_4_ = auVar59._20_4_ + fVar207;
      auVar188._24_4_ = auVar59._24_4_ + fVar208;
      auVar188._28_4_ = auVar59._28_4_ + auVar62._28_4_;
      auVar62 = vpermt2ps_avx512vl(auVar23,_DAT_01feed00,ZEXT1632(auVar50));
      auVar72 = vaddps_avx512vl(auVar78,auVar77);
      auVar77 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,ZEXT1632(auVar50));
      auVar62 = vsubps_avx(auVar61,auVar62);
      auVar77 = vsubps_avx512vl(auVar71,auVar77);
      in_ZMM17 = ZEXT3264(auVar77);
      auVar127 = ZEXT1632(auVar47);
      auVar73 = vsubps_avx512vl(auVar59,auVar127);
      auVar141 = ZEXT1632(auVar46);
      auVar57 = vsubps_avx512vl(auVar78,auVar141);
      auVar58 = vsubps_avx512vl(auVar61,auVar67);
      auVar73 = vaddps_avx512vl(auVar73,auVar58);
      auVar58 = vsubps_avx512vl(auVar71,auVar68);
      auVar57 = vaddps_avx512vl(auVar57,auVar58);
      auVar58 = vmulps_avx512vl(auVar141,auVar73);
      auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar127,auVar57);
      auVar74 = vmulps_avx512vl(auVar70,auVar73);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar110,auVar57);
      auVar75 = vmulps_avx512vl(auVar69,auVar73);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar60,auVar57);
      auVar76 = vmulps_avx512vl(auVar68,auVar73);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar67,auVar57);
      auVar79 = vmulps_avx512vl(auVar78,auVar73);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar59,auVar57);
      auVar80 = vmulps_avx512vl(auVar72,auVar73);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar188,auVar57);
      auVar81 = vmulps_avx512vl(auVar77,auVar73);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar62,auVar57);
      auVar73 = vmulps_avx512vl(auVar71,auVar73);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar61,auVar57);
      auVar57 = vminps_avx512vl(auVar58,auVar74);
      auVar58 = vmaxps_avx512vl(auVar58,auVar74);
      auVar74 = vminps_avx512vl(auVar75,auVar76);
      auVar57 = vminps_avx512vl(auVar57,auVar74);
      auVar74 = vmaxps_avx512vl(auVar75,auVar76);
      auVar58 = vmaxps_avx512vl(auVar58,auVar74);
      auVar74 = vminps_avx512vl(auVar79,auVar80);
      auVar75 = vmaxps_avx512vl(auVar79,auVar80);
      auVar76 = vminps_avx512vl(auVar81,auVar73);
      auVar74 = vminps_avx512vl(auVar74,auVar76);
      auVar57 = vminps_avx512vl(auVar57,auVar74);
      auVar73 = vmaxps_avx512vl(auVar81,auVar73);
      auVar73 = vmaxps_avx512vl(auVar75,auVar73);
      auVar73 = vmaxps_avx512vl(auVar58,auVar73);
      uVar10 = vcmpps_avx512vl(auVar57,local_d8,2);
      auVar24._4_4_ = uStack_74;
      auVar24._0_4_ = local_78;
      auVar24._8_4_ = uStack_70;
      auVar24._12_4_ = uStack_6c;
      auVar24._16_4_ = uStack_68;
      auVar24._20_4_ = uStack_64;
      auVar24._24_4_ = uStack_60;
      auVar24._28_4_ = uStack_5c;
      uVar11 = vcmpps_avx512vl(auVar73,auVar24,5);
      bVar25 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar25 != 0) {
        auVar73 = vsubps_avx512vl(auVar67,auVar127);
        auVar57 = vsubps_avx512vl(auVar68,auVar141);
        auVar58 = vsubps_avx512vl(auVar61,auVar59);
        auVar73 = vaddps_avx512vl(auVar73,auVar58);
        auVar58 = vsubps_avx512vl(auVar71,auVar78);
        auVar57 = vaddps_avx512vl(auVar57,auVar58);
        auVar58 = vmulps_avx512vl(auVar141,auVar73);
        auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar57,auVar127);
        auVar70 = vmulps_avx512vl(auVar70,auVar73);
        auVar70 = vfnmadd213ps_avx512vl(auVar110,auVar57,auVar70);
        auVar69 = vmulps_avx512vl(auVar69,auVar73);
        auVar69 = vfnmadd213ps_avx512vl(auVar60,auVar57,auVar69);
        auVar60 = vmulps_avx512vl(auVar68,auVar73);
        auVar68 = vfnmadd231ps_avx512vl(auVar60,auVar57,auVar67);
        auVar60 = vmulps_avx512vl(auVar78,auVar73);
        auVar78 = vfnmadd231ps_avx512vl(auVar60,auVar57,auVar59);
        auVar60 = vmulps_avx512vl(auVar72,auVar73);
        auVar59 = vfnmadd213ps_avx512vl(auVar188,auVar57,auVar60);
        auVar60 = vmulps_avx512vl(auVar77,auVar73);
        auVar72 = vfnmadd213ps_avx512vl(auVar62,auVar57,auVar60);
        auVar62 = vmulps_avx512vl(auVar71,auVar73);
        auVar61 = vfnmadd231ps_avx512vl(auVar62,auVar61,auVar57);
        auVar60 = vminps_avx(auVar58,auVar70);
        auVar62 = vmaxps_avx(auVar58,auVar70);
        auVar67 = vminps_avx(auVar69,auVar68);
        auVar67 = vminps_avx(auVar60,auVar67);
        auVar60 = vmaxps_avx(auVar69,auVar68);
        auVar62 = vmaxps_avx(auVar62,auVar60);
        auVar77 = vminps_avx(auVar78,auVar59);
        auVar60 = vmaxps_avx(auVar78,auVar59);
        auVar78 = vminps_avx(auVar72,auVar61);
        auVar77 = vminps_avx(auVar77,auVar78);
        auVar77 = vminps_avx(auVar67,auVar77);
        auVar67 = vmaxps_avx(auVar72,auVar61);
        auVar60 = vmaxps_avx(auVar60,auVar67);
        auVar62 = vmaxps_avx(auVar62,auVar60);
        uVar10 = vcmpps_avx512vl(auVar62,auVar24,5);
        uVar11 = vcmpps_avx512vl(auVar77,local_d8,2);
        bVar25 = bVar25 & (byte)uVar10 & (byte)uVar11;
        if (bVar25 != 0) {
          auStack_198[uVar27] = (uint)bVar25;
          uVar10 = vmovlps_avx(auVar39);
          (&uStack_b8)[uVar27] = uVar10;
          uVar34 = vmovlps_avx(auVar40);
          auStack_58[uVar27] = uVar34;
          uVar27 = (ulong)((int)uVar27 + 1);
        }
      }
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar234 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar235 = ZEXT1664(auVar39);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar236 = ZEXT3264(auVar62);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar237 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar238 = ZEXT1664(auVar39);
      auVar239 = ZEXT3264(_DAT_01feed20);
      auVar75._16_16_ = DAT_01feed20._16_16_;
      auVar241 = ZEXT1664(local_318);
      if ((int)uVar27 != 0) {
        do {
          auVar51 = auVar242._0_16_;
          auVar52 = auVar240._0_16_;
          uVar26 = (int)uVar27 - 1;
          uVar28 = (ulong)uVar26;
          uVar5 = auStack_198[uVar28];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = auStack_58[uVar28];
          uVar34 = 0;
          for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            uVar34 = uVar34 + 1;
          }
          uVar30 = uVar5 - 1 & uVar5;
          bVar37 = uVar30 == 0;
          auStack_198[uVar28] = uVar30;
          if (bVar37) {
            uVar27 = (ulong)uVar26;
          }
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar34;
          auVar39 = vpunpcklqdq_avx(auVar95,ZEXT416((int)uVar34 + 1));
          auVar39 = vcvtqq2ps_avx512vl(auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar237._0_16_);
          uVar94 = *(undefined4 *)((long)&uStack_b8 + uVar28 * 8 + 4);
          auVar12._4_4_ = uVar94;
          auVar12._0_4_ = uVar94;
          auVar12._8_4_ = uVar94;
          auVar12._12_4_ = uVar94;
          auVar50 = vmulps_avx512vl(auVar39,auVar12);
          auVar49 = auVar238._0_16_;
          auVar39 = vsubps_avx512vl(auVar49,auVar39);
          uVar94 = *(undefined4 *)(&uStack_b8 + uVar28);
          auVar13._4_4_ = uVar94;
          auVar13._0_4_ = uVar94;
          auVar13._8_4_ = uVar94;
          auVar13._12_4_ = uVar94;
          auVar39 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar13);
          auVar50 = vmovshdup_avx(auVar39);
          fVar208 = auVar50._0_4_ - auVar39._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar208));
          if (uVar5 == 0 || bVar37) goto LAB_01d2feed;
          auVar50 = vshufps_avx(auVar40,auVar40,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar208));
          auVar48 = vsubps_avx512vl(auVar49,auVar50);
          fVar93 = auVar50._0_4_;
          auVar135._0_4_ = fVar93 * (float)local_2c8._0_4_;
          fVar201 = auVar50._4_4_;
          auVar135._4_4_ = fVar201 * (float)local_2c8._4_4_;
          fVar203 = auVar50._8_4_;
          auVar135._8_4_ = fVar203 * fStack_2c0;
          fVar205 = auVar50._12_4_;
          auVar135._12_4_ = fVar205 * fStack_2bc;
          auVar146._0_4_ = fVar93 * (float)local_2d8._0_4_;
          auVar146._4_4_ = fVar201 * (float)local_2d8._4_4_;
          auVar146._8_4_ = fVar203 * fStack_2d0;
          auVar146._12_4_ = fVar205 * fStack_2cc;
          auVar154._0_4_ = fVar93 * (float)local_2e8._0_4_;
          auVar154._4_4_ = fVar201 * (float)local_2e8._4_4_;
          auVar154._8_4_ = fVar203 * fStack_2e0;
          auVar154._12_4_ = fVar205 * fStack_2dc;
          auVar112._0_4_ = fVar93 * (float)local_2f8._0_4_;
          auVar112._4_4_ = fVar201 * (float)local_2f8._4_4_;
          auVar112._8_4_ = fVar203 * fStack_2f0;
          auVar112._12_4_ = fVar205 * fStack_2ec;
          auVar47 = vfmadd231ps_avx512vl(auVar135,auVar48,auVar52);
          auVar46 = vfmadd231ps_avx512vl(auVar146,auVar48,auVar51);
          auVar50 = vfmadd231ps_fma(auVar154,auVar48,local_2a8);
          auVar48 = vfmadd231ps_fma(auVar112,auVar48,local_2b8);
          auVar128._16_16_ = auVar47;
          auVar128._0_16_ = auVar47;
          auVar142._16_16_ = auVar46;
          auVar142._0_16_ = auVar46;
          auVar150._16_16_ = auVar50;
          auVar150._0_16_ = auVar50;
          auVar60 = vpermps_avx512vl(auVar239._0_32_,ZEXT1632(auVar39));
          auVar62 = vsubps_avx(auVar142,auVar128);
          auVar47 = vfmadd213ps_fma(auVar62,auVar60,auVar128);
          auVar62 = vsubps_avx(auVar150,auVar142);
          auVar46 = vfmadd213ps_fma(auVar62,auVar60,auVar142);
          auVar50 = vsubps_avx(auVar48,auVar50);
          auVar143._16_16_ = auVar50;
          auVar143._0_16_ = auVar50;
          auVar50 = vfmadd213ps_fma(auVar143,auVar60,auVar150);
          auVar62 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar47));
          auVar48 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar47));
          auVar62 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar46));
          auVar50 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar46));
          auVar62 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar48));
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar62,auVar60);
          auVar62 = vmulps_avx512vl(auVar62,auVar236._0_32_);
          auVar75._16_16_ = auVar62._16_16_;
          auVar50 = vmulss_avx512f(ZEXT416((uint)fVar208),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar93 = auVar50._0_4_;
          auVar155._0_8_ =
               CONCAT44(auVar101._4_4_ + fVar93 * auVar62._4_4_,
                        auVar101._0_4_ + fVar93 * auVar62._0_4_);
          auVar155._8_4_ = auVar101._8_4_ + fVar93 * auVar62._8_4_;
          auVar155._12_4_ = auVar101._12_4_ + fVar93 * auVar62._12_4_;
          auVar136._0_4_ = fVar93 * auVar62._16_4_;
          auVar136._4_4_ = fVar93 * auVar62._20_4_;
          auVar136._8_4_ = fVar93 * auVar62._24_4_;
          auVar136._12_4_ = fVar93 * auVar62._28_4_;
          auVar45 = vsubps_avx((undefined1  [16])0x0,auVar136);
          auVar42 = vshufpd_avx(auVar101,auVar101,3);
          auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar50 = vsubps_avx(auVar42,auVar101);
          auVar48 = vsubps_avx(auVar41,(undefined1  [16])0x0);
          auVar173._0_4_ = auVar50._0_4_ + auVar48._0_4_;
          auVar173._4_4_ = auVar50._4_4_ + auVar48._4_4_;
          auVar173._8_4_ = auVar50._8_4_ + auVar48._8_4_;
          auVar173._12_4_ = auVar50._12_4_ + auVar48._12_4_;
          auVar50 = vshufps_avx(auVar101,auVar101,0xb1);
          auVar48 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar47 = vshufps_avx(auVar45,auVar45,0xb1);
          auVar46 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar226._4_4_ = auVar173._0_4_;
          auVar226._0_4_ = auVar173._0_4_;
          auVar226._8_4_ = auVar173._0_4_;
          auVar226._12_4_ = auVar173._0_4_;
          auVar43 = vshufps_avx(auVar173,auVar173,0x55);
          fVar93 = auVar43._0_4_;
          auVar184._0_4_ = auVar50._0_4_ * fVar93;
          fVar201 = auVar43._4_4_;
          auVar184._4_4_ = auVar50._4_4_ * fVar201;
          fVar203 = auVar43._8_4_;
          auVar184._8_4_ = auVar50._8_4_ * fVar203;
          fVar205 = auVar43._12_4_;
          auVar184._12_4_ = auVar50._12_4_ * fVar205;
          auVar192._0_4_ = auVar48._0_4_ * fVar93;
          auVar192._4_4_ = auVar48._4_4_ * fVar201;
          auVar192._8_4_ = auVar48._8_4_ * fVar203;
          auVar192._12_4_ = auVar48._12_4_ * fVar205;
          auVar211._0_4_ = auVar47._0_4_ * fVar93;
          auVar211._4_4_ = auVar47._4_4_ * fVar201;
          auVar211._8_4_ = auVar47._8_4_ * fVar203;
          auVar211._12_4_ = auVar47._12_4_ * fVar205;
          auVar174._0_4_ = auVar46._0_4_ * fVar93;
          auVar174._4_4_ = auVar46._4_4_ * fVar201;
          auVar174._8_4_ = auVar46._8_4_ * fVar203;
          auVar174._12_4_ = auVar46._12_4_ * fVar205;
          auVar50 = vfmadd231ps_fma(auVar184,auVar226,auVar101);
          auVar48 = vfmadd231ps_fma(auVar192,auVar226,auVar155);
          auVar55 = vfmadd231ps_fma(auVar211,auVar226,auVar45);
          auVar100 = vfmadd231ps_fma(auVar174,(undefined1  [16])0x0,auVar226);
          auVar43 = vshufpd_avx(auVar50,auVar50,1);
          auVar44 = vshufpd_avx(auVar48,auVar48,1);
          auVar53 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar54 = vshufpd_avx512vl(auVar100,auVar100,1);
          in_ZMM17 = ZEXT1664(auVar54);
          auVar47 = vminss_avx(auVar50,auVar48);
          auVar50 = vmaxss_avx(auVar48,auVar50);
          auVar46 = vminss_avx(auVar55,auVar100);
          auVar48 = vmaxss_avx(auVar100,auVar55);
          auVar47 = vminss_avx(auVar47,auVar46);
          auVar50 = vmaxss_avx(auVar48,auVar50);
          auVar46 = vminss_avx(auVar43,auVar44);
          auVar48 = vmaxss_avx(auVar44,auVar43);
          auVar43 = vminss_avx512f(auVar53,auVar54);
          auVar44 = vmaxss_avx512f(auVar54,auVar53);
          auVar48 = vmaxss_avx(auVar44,auVar48);
          auVar46 = vminss_avx512f(auVar46,auVar43);
          fVar201 = auVar48._0_4_;
          fVar93 = auVar50._0_4_;
          if (0.0001 <= auVar47._0_4_) {
LAB_01d30612:
            vucomiss_avx512f(auVar46);
            bVar38 = fVar201 <= -0.0001;
            bVar36 = -0.0001 < fVar93;
            bVar35 = bVar38;
            if (!bVar38) goto LAB_01d30668;
            uVar10 = vcmpps_avx512vl(auVar47,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar11 = vcmpps_avx512vl(auVar46,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar25 = (byte)uVar10 & (byte)uVar11 & 1;
            bVar38 = bVar36 && bVar25 == 0;
            bVar35 = bVar36 && bVar25 == 0;
            if (bVar36 && bVar25 == 0) goto LAB_01d30668;
          }
          else {
            bVar38 = fVar201 == -0.0001;
            bVar35 = NAN(fVar201);
            if (fVar201 <= -0.0001) goto LAB_01d30612;
LAB_01d30668:
            auVar44 = vxorps_avx512vl(auVar52,auVar52);
            vcmpss_avx512f(auVar47,auVar44,1);
            uVar10 = vcmpss_avx512f(auVar50,auVar44,1);
            bVar36 = (bool)((byte)uVar10 & 1);
            auVar75._0_16_ = auVar243._0_16_;
            auVar82._4_28_ = auVar75._4_28_;
            auVar82._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar243._0_4_);
            vucomiss_avx512f(auVar82._0_16_);
            bVar35 = (bool)(!bVar38 | bVar35);
            bVar36 = bVar35 == false;
            auVar84._16_16_ = auVar75._16_16_;
            auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar83._4_28_ = auVar84._4_28_;
            auVar83._0_4_ = (uint)bVar35 * auVar44._0_4_ + (uint)!bVar35 * 0x7f800000;
            auVar43 = auVar83._0_16_;
            auVar86._16_16_ = auVar75._16_16_;
            auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar35 * auVar44._0_4_ + (uint)!bVar35 * -0x800000;
            auVar52 = auVar85._0_16_;
            auVar51 = vxorps_avx512vl(auVar51,auVar51);
            uVar10 = vcmpss_avx512f(auVar46,auVar44,1);
            bVar38 = (bool)((byte)uVar10 & 1);
            auVar88._16_16_ = auVar75._16_16_;
            auVar88._0_16_ = auVar243._0_16_;
            auVar87._4_28_ = auVar88._4_28_;
            auVar87._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar243._0_4_);
            vucomiss_avx512f(auVar87._0_16_);
            if ((bVar35) || (bVar36)) {
              auVar46 = vucomiss_avx512f(auVar47);
              if ((bVar35) || (bVar36)) {
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar44 = vxorps_avx512vl(auVar47,auVar16);
                auVar47 = vsubss_avx512f(auVar46,auVar47);
                auVar47 = vdivss_avx512f(auVar44,auVar47);
                auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar47);
                auVar46 = vfmadd213ss_avx512f(auVar46,auVar51,auVar47);
                auVar47 = auVar46;
              }
              else {
                auVar47 = vxorps_avx512vl(auVar46,auVar46);
                vucomiss_avx512f(auVar47);
                auVar46 = ZEXT416(0x3f800000);
                if ((bVar35) || (bVar36)) {
                  auVar46 = SUB6416(ZEXT464(0xff800000),0);
                  auVar47 = SUB6416(ZEXT464(0x7f800000),0);
                }
              }
              auVar43 = vminss_avx512f(auVar43,auVar47);
              auVar52 = vmaxss_avx(auVar46,auVar52);
            }
            auVar243 = ZEXT464(0x3f800000);
            in_ZMM17 = ZEXT1664(local_298);
            uVar10 = vcmpss_avx512f(auVar48,auVar51,1);
            bVar38 = (bool)((byte)uVar10 & 1);
            auVar48 = auVar243._0_16_;
            fVar203 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
            if ((auVar82._0_4_ != fVar203) || (NAN(auVar82._0_4_) || NAN(fVar203))) {
              if ((fVar201 != fVar93) || (NAN(fVar201) || NAN(fVar93))) {
                auVar15._8_4_ = 0x80000000;
                auVar15._0_8_ = 0x8000000080000000;
                auVar15._12_4_ = 0x80000000;
                auVar50 = vxorps_avx512vl(auVar50,auVar15);
                auVar175._0_4_ = auVar50._0_4_ / (fVar201 - fVar93);
                auVar175._4_12_ = auVar50._4_12_;
                auVar50 = vsubss_avx512f(auVar48,auVar175);
                auVar50 = vfmadd213ss_avx512f(auVar50,auVar51,auVar175);
                auVar47 = auVar50;
              }
              else if ((fVar93 != 0.0) ||
                      (auVar50 = auVar48, auVar47 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar93))) {
                auVar50 = SUB6416(ZEXT464(0xff800000),0);
                auVar47 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar43 = vminss_avx(auVar43,auVar47);
              auVar52 = vmaxss_avx(auVar50,auVar52);
            }
            bVar38 = auVar87._0_4_ != fVar203;
            auVar50 = vminss_avx512f(auVar43,auVar48);
            auVar90._16_16_ = auVar75._16_16_;
            auVar90._0_16_ = auVar43;
            auVar89._4_28_ = auVar90._4_28_;
            auVar89._0_4_ = (uint)bVar38 * auVar50._0_4_ + (uint)!bVar38 * auVar43._0_4_;
            auVar50 = vmaxss_avx512f(auVar48,auVar52);
            auVar92._16_16_ = auVar75._16_16_;
            auVar92._0_16_ = auVar52;
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar38 * auVar50._0_4_ + (uint)!bVar38 * auVar52._0_4_;
            auVar52 = vmaxss_avx512f(auVar51,auVar89._0_16_);
            auVar50 = vminss_avx512f(auVar91._0_16_,auVar48);
            if (auVar52._0_4_ <= auVar50._0_4_) {
              auVar46 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar52._0_4_ + -0.1)));
              auVar55 = vminss_avx512f(ZEXT416((uint)(auVar50._0_4_ + 0.1)),auVar48);
              auVar113._0_8_ = auVar101._0_8_;
              auVar113._8_8_ = auVar113._0_8_;
              auVar193._8_8_ = auVar155._0_8_;
              auVar193._0_8_ = auVar155._0_8_;
              auVar212._8_8_ = auVar45._0_8_;
              auVar212._0_8_ = auVar45._0_8_;
              auVar52 = vshufpd_avx(auVar155,auVar155,3);
              auVar50 = vshufpd_avx(auVar45,auVar45,3);
              auVar47 = vshufps_avx(auVar46,auVar55,0);
              auVar44 = vsubps_avx512vl(auVar49,auVar47);
              fVar93 = auVar47._0_4_;
              auVar147._0_4_ = fVar93 * auVar42._0_4_;
              fVar201 = auVar47._4_4_;
              auVar147._4_4_ = fVar201 * auVar42._4_4_;
              fVar203 = auVar47._8_4_;
              auVar147._8_4_ = fVar203 * auVar42._8_4_;
              fVar205 = auVar47._12_4_;
              auVar147._12_4_ = fVar205 * auVar42._12_4_;
              auVar156._0_4_ = fVar93 * auVar52._0_4_;
              auVar156._4_4_ = fVar201 * auVar52._4_4_;
              auVar156._8_4_ = fVar203 * auVar52._8_4_;
              auVar156._12_4_ = fVar205 * auVar52._12_4_;
              auVar229._0_4_ = auVar50._0_4_ * fVar93;
              auVar229._4_4_ = auVar50._4_4_ * fVar201;
              auVar229._8_4_ = auVar50._8_4_ * fVar203;
              auVar229._12_4_ = auVar50._12_4_ * fVar205;
              auVar137._0_4_ = fVar93 * auVar41._0_4_;
              auVar137._4_4_ = fVar201 * auVar41._4_4_;
              auVar137._8_4_ = fVar203 * auVar41._8_4_;
              auVar137._12_4_ = fVar205 * auVar41._12_4_;
              auVar42 = vfmadd231ps_fma(auVar147,auVar44,auVar113);
              auVar41 = vfmadd231ps_fma(auVar156,auVar44,auVar193);
              auVar43 = vfmadd231ps_fma(auVar229,auVar44,auVar212);
              auVar44 = vfmadd231ps_fma(auVar137,auVar44,ZEXT816(0));
              auVar50 = vsubss_avx512f(auVar48,auVar46);
              auVar52 = vmovshdup_avx(auVar40);
              auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar46._0_4_)),auVar40,
                                         auVar50);
              auVar50 = vsubss_avx512f(auVar48,auVar55);
              auVar101 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar55._0_4_)),auVar40,
                                         auVar50);
              auVar40 = vdivss_avx512f(auVar48,ZEXT416((uint)fVar208));
              auVar52 = vsubps_avx(auVar41,auVar42);
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar47 = vmulps_avx512vl(auVar52,auVar45);
              auVar52 = vsubps_avx(auVar43,auVar41);
              auVar46 = vmulps_avx512vl(auVar52,auVar45);
              auVar52 = vsubps_avx(auVar44,auVar43);
              auVar52 = vmulps_avx512vl(auVar52,auVar45);
              auVar50 = vminps_avx(auVar46,auVar52);
              auVar52 = vmaxps_avx(auVar46,auVar52);
              auVar50 = vminps_avx(auVar47,auVar50);
              auVar52 = vmaxps_avx(auVar47,auVar52);
              auVar47 = vshufpd_avx(auVar50,auVar50,3);
              auVar46 = vshufpd_avx(auVar52,auVar52,3);
              auVar50 = vminps_avx(auVar50,auVar47);
              auVar52 = vmaxps_avx(auVar52,auVar46);
              fVar208 = auVar40._0_4_;
              auVar176._0_4_ = auVar50._0_4_ * fVar208;
              auVar176._4_4_ = auVar50._4_4_ * fVar208;
              auVar176._8_4_ = auVar50._8_4_ * fVar208;
              auVar176._12_4_ = auVar50._12_4_ * fVar208;
              auVar165._0_4_ = fVar208 * auVar52._0_4_;
              auVar165._4_4_ = fVar208 * auVar52._4_4_;
              auVar165._8_4_ = fVar208 * auVar52._8_4_;
              auVar165._12_4_ = fVar208 * auVar52._12_4_;
              auVar55 = vdivss_avx512f(auVar48,ZEXT416((uint)(auVar101._0_4_ - auVar100._0_4_)));
              auVar52 = vshufpd_avx(auVar42,auVar42,3);
              auVar50 = vshufpd_avx(auVar41,auVar41,3);
              auVar47 = vshufpd_avx(auVar43,auVar43,3);
              auVar46 = vshufpd_avx(auVar44,auVar44,3);
              auVar52 = vsubps_avx(auVar52,auVar42);
              auVar42 = vsubps_avx(auVar50,auVar41);
              auVar40 = vsubps_avx(auVar47,auVar43);
              auVar46 = vsubps_avx(auVar46,auVar44);
              auVar50 = vminps_avx(auVar52,auVar42);
              auVar52 = vmaxps_avx(auVar52,auVar42);
              auVar47 = vminps_avx(auVar40,auVar46);
              auVar47 = vminps_avx(auVar50,auVar47);
              auVar50 = vmaxps_avx(auVar40,auVar46);
              auVar52 = vmaxps_avx(auVar52,auVar50);
              fVar208 = auVar55._0_4_;
              auVar213._0_4_ = fVar208 * auVar47._0_4_;
              auVar213._4_4_ = fVar208 * auVar47._4_4_;
              auVar213._8_4_ = fVar208 * auVar47._8_4_;
              auVar213._12_4_ = fVar208 * auVar47._12_4_;
              auVar194._0_4_ = fVar208 * auVar52._0_4_;
              auVar194._4_4_ = fVar208 * auVar52._4_4_;
              auVar194._8_4_ = fVar208 * auVar52._8_4_;
              auVar194._12_4_ = fVar208 * auVar52._12_4_;
              auVar46 = vinsertps_avx(auVar39,auVar100,0x10);
              auVar53 = vpermt2ps_avx512vl(auVar39,_DAT_01feecd0,auVar101);
              auVar102._0_4_ = auVar46._0_4_ + auVar53._0_4_;
              auVar102._4_4_ = auVar46._4_4_ + auVar53._4_4_;
              auVar102._8_4_ = auVar46._8_4_ + auVar53._8_4_;
              auVar102._12_4_ = auVar46._12_4_ + auVar53._12_4_;
              auVar44 = vmulps_avx512vl(auVar102,auVar234._0_16_);
              auVar50 = vshufps_avx(auVar44,auVar44,0x54);
              uVar94 = auVar44._0_4_;
              auVar106._4_4_ = uVar94;
              auVar106._0_4_ = uVar94;
              auVar106._8_4_ = uVar94;
              auVar106._12_4_ = uVar94;
              auVar40 = vfmadd213ps_avx512vl(auVar241._0_16_,auVar106,local_298);
              auVar47 = vfmadd213ps_fma(local_108,auVar106,local_1a8);
              auVar42 = vfmadd213ps_fma(local_118,auVar106,local_1b8);
              auVar52 = vsubps_avx(auVar47,auVar40);
              auVar40 = vfmadd213ps_fma(auVar52,auVar106,auVar40);
              auVar52 = vsubps_avx(auVar42,auVar47);
              auVar52 = vfmadd213ps_fma(auVar52,auVar106,auVar47);
              auVar52 = vsubps_avx(auVar52,auVar40);
              auVar47 = vfmadd231ps_fma(auVar40,auVar52,auVar106);
              auVar41 = vmulps_avx512vl(auVar52,auVar45);
              auVar220._8_8_ = auVar47._0_8_;
              auVar220._0_8_ = auVar47._0_8_;
              auVar52 = vshufpd_avx(auVar47,auVar47,3);
              auVar47 = vshufps_avx(auVar44,auVar44,0x55);
              auVar42 = vsubps_avx(auVar52,auVar220);
              auVar40 = vfmadd231ps_fma(auVar220,auVar47,auVar42);
              auVar230._8_8_ = auVar41._0_8_;
              auVar230._0_8_ = auVar41._0_8_;
              auVar52 = vshufpd_avx(auVar41,auVar41,3);
              auVar52 = vsubps_avx512vl(auVar52,auVar230);
              auVar52 = vfmadd213ps_avx512vl(auVar52,auVar47,auVar230);
              auVar47 = vxorps_avx512vl(auVar42,auVar244._0_16_);
              auVar41 = vmovshdup_avx512vl(auVar52);
              auVar43 = vxorps_avx512vl(auVar41,auVar244._0_16_);
              auVar45 = vmovshdup_avx512vl(auVar42);
              auVar43 = vpermt2ps_avx512vl(auVar43,ZEXT416(5),auVar42);
              auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar42._0_4_)),auVar52,
                                            auVar45);
              auVar47 = vpermt2ps_avx512vl(auVar52,SUB6416(ZEXT464(4),0),auVar47);
              auVar138._0_4_ = auVar42._0_4_;
              auVar138._4_4_ = auVar138._0_4_;
              auVar138._8_4_ = auVar138._0_4_;
              auVar138._12_4_ = auVar138._0_4_;
              auVar52 = vdivps_avx(auVar43,auVar138);
              auVar54 = vdivps_avx512vl(auVar47,auVar138);
              fVar208 = auVar40._0_4_;
              auVar47 = vshufps_avx(auVar40,auVar40,0x55);
              auVar221._0_4_ = fVar208 * auVar52._0_4_ + auVar47._0_4_ * auVar54._0_4_;
              auVar221._4_4_ = fVar208 * auVar52._4_4_ + auVar47._4_4_ * auVar54._4_4_;
              auVar221._8_4_ = fVar208 * auVar52._8_4_ + auVar47._8_4_ * auVar54._8_4_;
              auVar221._12_4_ = fVar208 * auVar52._12_4_ + auVar47._12_4_ * auVar54._12_4_;
              auVar45 = vsubps_avx(auVar50,auVar221);
              auVar47 = vmovshdup_avx(auVar52);
              auVar50 = vinsertps_avx(auVar176,auVar213,0x1c);
              auVar231._0_4_ = auVar47._0_4_ * auVar50._0_4_;
              auVar231._4_4_ = auVar47._4_4_ * auVar50._4_4_;
              auVar231._8_4_ = auVar47._8_4_ * auVar50._8_4_;
              auVar231._12_4_ = auVar47._12_4_ * auVar50._12_4_;
              auVar55 = vinsertps_avx512f(auVar165,auVar194,0x1c);
              auVar47 = vmulps_avx512vl(auVar47,auVar55);
              auVar43 = vminps_avx512vl(auVar231,auVar47);
              auVar40 = vmaxps_avx(auVar47,auVar231);
              auVar41 = vmovshdup_avx(auVar54);
              auVar47 = vinsertps_avx(auVar213,auVar176,0x4c);
              auVar214._0_4_ = auVar41._0_4_ * auVar47._0_4_;
              auVar214._4_4_ = auVar41._4_4_ * auVar47._4_4_;
              auVar214._8_4_ = auVar41._8_4_ * auVar47._8_4_;
              auVar214._12_4_ = auVar41._12_4_ * auVar47._12_4_;
              auVar42 = vinsertps_avx(auVar194,auVar165,0x4c);
              auVar195._0_4_ = auVar41._0_4_ * auVar42._0_4_;
              auVar195._4_4_ = auVar41._4_4_ * auVar42._4_4_;
              auVar195._8_4_ = auVar41._8_4_ * auVar42._8_4_;
              auVar195._12_4_ = auVar41._12_4_ * auVar42._12_4_;
              auVar41 = vminps_avx(auVar214,auVar195);
              auVar43 = vaddps_avx512vl(auVar43,auVar41);
              auVar41 = vmaxps_avx(auVar195,auVar214);
              auVar196._0_4_ = auVar40._0_4_ + auVar41._0_4_;
              auVar196._4_4_ = auVar40._4_4_ + auVar41._4_4_;
              auVar196._8_4_ = auVar40._8_4_ + auVar41._8_4_;
              auVar196._12_4_ = auVar40._12_4_ + auVar41._12_4_;
              auVar215._8_8_ = 0x3f80000000000000;
              auVar215._0_8_ = 0x3f80000000000000;
              auVar40 = vsubps_avx(auVar215,auVar196);
              auVar41 = vsubps_avx(auVar215,auVar43);
              auVar43 = vsubps_avx(auVar46,auVar44);
              auVar44 = vsubps_avx(auVar53,auVar44);
              fVar205 = auVar43._0_4_;
              auVar232._0_4_ = fVar205 * auVar40._0_4_;
              fVar206 = auVar43._4_4_;
              auVar232._4_4_ = fVar206 * auVar40._4_4_;
              fVar207 = auVar43._8_4_;
              auVar232._8_4_ = fVar207 * auVar40._8_4_;
              fVar99 = auVar43._12_4_;
              auVar232._12_4_ = fVar99 * auVar40._12_4_;
              auVar56 = vbroadcastss_avx512vl(auVar52);
              auVar50 = vmulps_avx512vl(auVar56,auVar50);
              auVar55 = vmulps_avx512vl(auVar56,auVar55);
              auVar56 = vminps_avx512vl(auVar50,auVar55);
              auVar55 = vmaxps_avx512vl(auVar55,auVar50);
              auVar50 = vbroadcastss_avx512vl(auVar54);
              auVar47 = vmulps_avx512vl(auVar50,auVar47);
              auVar50 = vmulps_avx512vl(auVar50,auVar42);
              auVar42 = vminps_avx512vl(auVar47,auVar50);
              auVar42 = vaddps_avx512vl(auVar56,auVar42);
              auVar43 = vmulps_avx512vl(auVar43,auVar41);
              in_ZMM17 = ZEXT1664(auVar43);
              fVar208 = auVar44._0_4_;
              auVar197._0_4_ = fVar208 * auVar40._0_4_;
              fVar93 = auVar44._4_4_;
              auVar197._4_4_ = fVar93 * auVar40._4_4_;
              fVar201 = auVar44._8_4_;
              auVar197._8_4_ = fVar201 * auVar40._8_4_;
              fVar203 = auVar44._12_4_;
              auVar197._12_4_ = fVar203 * auVar40._12_4_;
              auVar216._0_4_ = fVar208 * auVar41._0_4_;
              auVar216._4_4_ = fVar93 * auVar41._4_4_;
              auVar216._8_4_ = fVar201 * auVar41._8_4_;
              auVar216._12_4_ = fVar203 * auVar41._12_4_;
              auVar50 = vmaxps_avx(auVar50,auVar47);
              auVar166._0_4_ = auVar55._0_4_ + auVar50._0_4_;
              auVar166._4_4_ = auVar55._4_4_ + auVar50._4_4_;
              auVar166._8_4_ = auVar55._8_4_ + auVar50._8_4_;
              auVar166._12_4_ = auVar55._12_4_ + auVar50._12_4_;
              auVar177._8_8_ = 0x3f800000;
              auVar177._0_8_ = 0x3f800000;
              auVar50 = vsubps_avx(auVar177,auVar166);
              auVar47 = vsubps_avx512vl(auVar177,auVar42);
              auVar227._0_4_ = fVar205 * auVar50._0_4_;
              auVar227._4_4_ = fVar206 * auVar50._4_4_;
              auVar227._8_4_ = fVar207 * auVar50._8_4_;
              auVar227._12_4_ = fVar99 * auVar50._12_4_;
              auVar222._0_4_ = fVar205 * auVar47._0_4_;
              auVar222._4_4_ = fVar206 * auVar47._4_4_;
              auVar222._8_4_ = fVar207 * auVar47._8_4_;
              auVar222._12_4_ = fVar99 * auVar47._12_4_;
              auVar167._0_4_ = fVar208 * auVar50._0_4_;
              auVar167._4_4_ = fVar93 * auVar50._4_4_;
              auVar167._8_4_ = fVar201 * auVar50._8_4_;
              auVar167._12_4_ = fVar203 * auVar50._12_4_;
              auVar178._0_4_ = fVar208 * auVar47._0_4_;
              auVar178._4_4_ = fVar93 * auVar47._4_4_;
              auVar178._8_4_ = fVar201 * auVar47._8_4_;
              auVar178._12_4_ = fVar203 * auVar47._12_4_;
              auVar50 = vminps_avx(auVar227,auVar222);
              auVar47 = vminps_avx512vl(auVar167,auVar178);
              auVar42 = vminps_avx512vl(auVar50,auVar47);
              auVar50 = vmaxps_avx(auVar222,auVar227);
              auVar47 = vmaxps_avx(auVar178,auVar167);
              auVar47 = vmaxps_avx(auVar47,auVar50);
              auVar40 = vminps_avx512vl(auVar232,auVar43);
              auVar50 = vminps_avx(auVar197,auVar216);
              auVar50 = vminps_avx(auVar40,auVar50);
              auVar50 = vhaddps_avx(auVar42,auVar50);
              auVar40 = vmaxps_avx512vl(auVar43,auVar232);
              auVar42 = vmaxps_avx(auVar216,auVar197);
              auVar42 = vmaxps_avx(auVar42,auVar40);
              auVar47 = vhaddps_avx(auVar47,auVar42);
              auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
              auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
              auVar168._0_4_ = auVar50._0_4_ + auVar45._0_4_;
              auVar168._4_4_ = auVar50._4_4_ + auVar45._4_4_;
              auVar168._8_4_ = auVar50._8_4_ + auVar45._8_4_;
              auVar168._12_4_ = auVar50._12_4_ + auVar45._12_4_;
              auVar179._0_4_ = auVar47._0_4_ + auVar45._0_4_;
              auVar179._4_4_ = auVar47._4_4_ + auVar45._4_4_;
              auVar179._8_4_ = auVar47._8_4_ + auVar45._8_4_;
              auVar179._12_4_ = auVar47._12_4_ + auVar45._12_4_;
              auVar50 = vmaxps_avx(auVar46,auVar168);
              auVar47 = vminps_avx(auVar179,auVar53);
              uVar34 = vcmpps_avx512vl(auVar47,auVar50,1);
              if ((uVar34 & 3) == 0) {
                uVar34 = vcmpps_avx512vl(auVar179,auVar53,1);
                uVar10 = vcmpps_avx512vl(auVar39,auVar168,1);
                if (((ushort)uVar10 & (ushort)uVar34 & 1) == 0) {
                  bVar25 = 0;
                }
                else {
                  auVar50 = vmovshdup_avx(auVar168);
                  bVar25 = auVar100._0_4_ < auVar50._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar27 || uVar5 != 0 && !bVar37) | bVar25) != 1) {
                  auVar40 = vinsertps_avx(auVar100,auVar101,0x10);
                  auVar240 = ZEXT1664(local_1c8);
                  auVar242 = ZEXT1664(local_1d8);
                  goto LAB_01d2feed;
                }
                lVar29 = 200;
                do {
                  auVar39 = vsubss_avx512f(auVar48,auVar45);
                  fVar201 = auVar39._0_4_;
                  fVar208 = fVar201 * fVar201 * fVar201;
                  auVar39 = vmulss_avx512f(auVar45,ZEXT416(0x40400000));
                  fVar93 = auVar39._0_4_ * fVar201 * fVar201;
                  fVar203 = auVar45._0_4_;
                  auVar39 = vmulss_avx512f(ZEXT416((uint)(fVar203 * fVar203)),ZEXT416(0x40400000));
                  fVar201 = fVar201 * auVar39._0_4_;
                  auVar125._4_4_ = fVar208;
                  auVar125._0_4_ = fVar208;
                  auVar125._8_4_ = fVar208;
                  auVar125._12_4_ = fVar208;
                  auVar114._4_4_ = fVar93;
                  auVar114._0_4_ = fVar93;
                  auVar114._8_4_ = fVar93;
                  auVar114._12_4_ = fVar93;
                  auVar96._4_4_ = fVar201;
                  auVar96._0_4_ = fVar201;
                  auVar96._8_4_ = fVar201;
                  auVar96._12_4_ = fVar201;
                  fVar203 = fVar203 * fVar203 * fVar203;
                  auVar148._0_4_ = (float)local_f8._0_4_ * fVar203;
                  auVar148._4_4_ = (float)local_f8._4_4_ * fVar203;
                  auVar148._8_4_ = fStack_f0 * fVar203;
                  auVar148._12_4_ = fStack_ec * fVar203;
                  auVar39 = vfmadd231ps_fma(auVar148,local_1b8,auVar96);
                  auVar39 = vfmadd231ps_fma(auVar39,local_1a8,auVar114);
                  auVar39 = vfmadd231ps_fma(auVar39,local_298,auVar125);
                  auVar97._8_8_ = auVar39._0_8_;
                  auVar97._0_8_ = auVar39._0_8_;
                  auVar39 = vshufpd_avx(auVar39,auVar39,3);
                  auVar50 = vshufps_avx(auVar45,auVar45,0x55);
                  auVar39 = vsubps_avx(auVar39,auVar97);
                  auVar50 = vfmadd213ps_fma(auVar39,auVar50,auVar97);
                  fVar208 = auVar50._0_4_;
                  auVar39 = vshufps_avx(auVar50,auVar50,0x55);
                  auVar98._0_4_ = auVar52._0_4_ * fVar208 + auVar54._0_4_ * auVar39._0_4_;
                  auVar98._4_4_ = auVar52._4_4_ * fVar208 + auVar54._4_4_ * auVar39._4_4_;
                  auVar98._8_4_ = auVar52._8_4_ * fVar208 + auVar54._8_4_ * auVar39._8_4_;
                  auVar98._12_4_ = auVar52._12_4_ * fVar208 + auVar54._12_4_ * auVar39._12_4_;
                  auVar45 = vsubps_avx(auVar45,auVar98);
                  auVar39 = vandps_avx512vl(auVar50,auVar235._0_16_);
                  auVar50 = vprolq_avx512vl(auVar39,0x20);
                  auVar39 = vmaxss_avx(auVar50,auVar39);
                  bVar37 = auVar39._0_4_ <= (float)local_e8._0_4_;
                  if (auVar39._0_4_ < (float)local_e8._0_4_) {
                    auVar39 = vucomiss_avx512f(auVar51);
                    if (bVar37) {
                      auVar52 = vucomiss_avx512f(auVar39);
                      auVar243 = ZEXT1664(auVar52);
                      if (bVar37) {
                        vmovshdup_avx(auVar39);
                        auVar52 = vucomiss_avx512f(auVar51);
                        if (bVar37) {
                          auVar51 = vucomiss_avx512f(auVar52);
                          auVar243 = ZEXT1664(auVar51);
                          if (bVar37) {
                            auVar50 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar43 = vinsertps_avx(auVar50,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar1 = (ray->super_RayK<1>).org.field_0;
                            auVar50 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                            auVar50 = vdpps_avx(auVar50,auVar43,0x7f);
                            auVar48 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                            auVar48 = vdpps_avx(auVar48,auVar43,0x7f);
                            auVar47 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                            auVar47 = vdpps_avx(auVar47,auVar43,0x7f);
                            auVar46 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                            auVar46 = vdpps_avx(auVar46,auVar43,0x7f);
                            auVar42 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
                            auVar42 = vdpps_avx(auVar42,auVar43,0x7f);
                            auVar40 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                            auVar40 = vdpps_avx(auVar40,auVar43,0x7f);
                            auVar41 = vsubps_avx(_local_258,(undefined1  [16])aVar1);
                            auVar41 = vdpps_avx(auVar41,auVar43,0x7f);
                            auVar44 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                            auVar43 = vdpps_avx(auVar44,auVar43,0x7f);
                            auVar44 = vsubss_avx512f(auVar51,auVar52);
                            fVar208 = auVar52._0_4_;
                            auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar208)),
                                                      auVar44,auVar50);
                            auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar208)),
                                                      auVar44,auVar48);
                            auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar208)),
                                                      auVar44,auVar47);
                            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar43._0_4_)),
                                                      auVar44,auVar46);
                            auVar51 = vsubss_avx512f(auVar51,auVar39);
                            auVar149._0_4_ = auVar51._0_4_;
                            fVar93 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                            auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x40400000));
                            fVar201 = auVar51._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                            fVar208 = auVar39._0_4_;
                            auVar139._0_4_ = fVar208 * fVar208;
                            auVar139._4_4_ = auVar39._4_4_ * auVar39._4_4_;
                            auVar139._8_4_ = auVar39._8_4_ * auVar39._8_4_;
                            auVar139._12_4_ = auVar39._12_4_ * auVar39._12_4_;
                            auVar51 = vmulss_avx512f(auVar139,ZEXT416(0x40400000));
                            fVar203 = auVar149._0_4_ * auVar51._0_4_;
                            fVar206 = fVar208 * auVar139._0_4_;
                            auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar47._0_4_)),
                                                      ZEXT416((uint)fVar203),auVar48);
                            auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar201),auVar50);
                            auVar52 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar93),auVar52);
                            fVar205 = auVar52._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar205) &&
                               (fVar207 = (ray->super_RayK<1>).tfar, fVar205 <= fVar207)) {
                              auVar52 = vshufps_avx(auVar39,auVar39,0x55);
                              auVar49 = vsubps_avx512vl(auVar49,auVar52);
                              fVar99 = auVar52._0_4_;
                              auVar180._0_4_ = fVar99 * (float)local_1f8._0_4_;
                              fVar111 = auVar52._4_4_;
                              auVar180._4_4_ = fVar111 * (float)local_1f8._4_4_;
                              fVar118 = auVar52._8_4_;
                              auVar180._8_4_ = fVar118 * fStack_1f0;
                              fVar119 = auVar52._12_4_;
                              auVar180._12_4_ = fVar119 * fStack_1ec;
                              auVar185._0_4_ = fVar99 * (float)local_248._0_4_;
                              auVar185._4_4_ = fVar111 * (float)local_248._4_4_;
                              auVar185._8_4_ = fVar118 * fStack_240;
                              auVar185._12_4_ = fVar119 * fStack_23c;
                              auVar198._0_4_ = fVar99 * (float)local_258._0_4_;
                              auVar198._4_4_ = fVar111 * (float)local_258._4_4_;
                              auVar198._8_4_ = fVar118 * fStack_250;
                              auVar198._12_4_ = fVar119 * fStack_24c;
                              auVar157._0_4_ = fVar99 * (float)local_218._0_4_;
                              auVar157._4_4_ = fVar111 * (float)local_218._4_4_;
                              auVar157._8_4_ = fVar118 * fStack_210;
                              auVar157._12_4_ = fVar119 * fStack_20c;
                              auVar52 = vfmadd231ps_fma(auVar180,auVar49,local_1e8);
                              auVar51 = vfmadd231ps_fma(auVar185,auVar49,local_228);
                              auVar50 = vfmadd231ps_fma(auVar198,auVar49,local_238);
                              auVar49 = vfmadd231ps_fma(auVar157,auVar49,local_208);
                              auVar52 = vsubps_avx(auVar51,auVar52);
                              auVar51 = vsubps_avx(auVar50,auVar51);
                              auVar50 = vsubps_avx(auVar49,auVar50);
                              auVar199._0_4_ = fVar208 * auVar51._0_4_;
                              auVar199._4_4_ = fVar208 * auVar51._4_4_;
                              auVar199._8_4_ = fVar208 * auVar51._8_4_;
                              auVar199._12_4_ = fVar208 * auVar51._12_4_;
                              auVar149._4_4_ = auVar149._0_4_;
                              auVar149._8_4_ = auVar149._0_4_;
                              auVar149._12_4_ = auVar149._0_4_;
                              auVar52 = vfmadd231ps_fma(auVar199,auVar149,auVar52);
                              auVar158._0_4_ = fVar208 * auVar50._0_4_;
                              auVar158._4_4_ = fVar208 * auVar50._4_4_;
                              auVar158._8_4_ = fVar208 * auVar50._8_4_;
                              auVar158._12_4_ = fVar208 * auVar50._12_4_;
                              auVar51 = vfmadd231ps_fma(auVar158,auVar149,auVar51);
                              auVar159._0_4_ = fVar208 * auVar51._0_4_;
                              auVar159._4_4_ = fVar208 * auVar51._4_4_;
                              auVar159._8_4_ = fVar208 * auVar51._8_4_;
                              auVar159._12_4_ = fVar208 * auVar51._12_4_;
                              auVar52 = vfmadd231ps_fma(auVar159,auVar149,auVar52);
                              auVar14._8_4_ = 0x40400000;
                              auVar14._0_8_ = 0x4040000040400000;
                              auVar14._12_4_ = 0x40400000;
                              auVar52 = vmulps_avx512vl(auVar52,auVar14);
                              pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                              if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar140._0_4_ = fVar206 * (float)local_158._0_4_;
                                auVar140._4_4_ = fVar206 * (float)local_158._4_4_;
                                auVar140._8_4_ = fVar206 * fStack_150;
                                auVar140._12_4_ = fVar206 * fStack_14c;
                                auVar126._4_4_ = fVar203;
                                auVar126._0_4_ = fVar203;
                                auVar126._8_4_ = fVar203;
                                auVar126._12_4_ = fVar203;
                                auVar51 = vfmadd132ps_fma(auVar126,auVar140,local_148);
                                auVar115._4_4_ = fVar201;
                                auVar115._0_4_ = fVar201;
                                auVar115._8_4_ = fVar201;
                                auVar115._12_4_ = fVar201;
                                auVar51 = vfmadd132ps_fma(auVar115,auVar51,local_138);
                                auVar107._4_4_ = fVar93;
                                auVar107._0_4_ = fVar93;
                                auVar107._8_4_ = fVar93;
                                auVar107._12_4_ = fVar93;
                                auVar49 = vfmadd132ps_fma(auVar107,auVar51,local_128);
                                auVar51 = vshufps_avx(auVar49,auVar49,0xc9);
                                auVar50 = vshufps_avx(auVar52,auVar52,0xc9);
                                auVar108._0_4_ = auVar49._0_4_ * auVar50._0_4_;
                                auVar108._4_4_ = auVar49._4_4_ * auVar50._4_4_;
                                auVar108._8_4_ = auVar49._8_4_ * auVar50._8_4_;
                                auVar108._12_4_ = auVar49._12_4_ * auVar50._12_4_;
                                auVar52 = vfmsub231ps_fma(auVar108,auVar52,auVar51);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar205;
                                  auVar51 = vshufps_avx(auVar52,auVar52,0xe9);
                                  uVar10 = vmovlps_avx(auVar51);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                  (ray->Ng).field_0.field_0.z = auVar52._0_4_;
                                  uVar10 = vmovlps_avx(auVar39);
                                  ray->u = (float)(int)uVar10;
                                  ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                  ray->primID = (uint)local_300;
                                  ray->geomID = uVar32;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar51 = vshufps_avx(auVar52,auVar52,0xe9);
                                  local_188 = vmovlps_avx(auVar51);
                                  local_180 = auVar52._0_4_;
                                  local_17c = vmovlps_avx(auVar39);
                                  local_174 = (uint)local_300;
                                  local_170 = uVar32;
                                  local_16c = context->user->instID[0];
                                  local_168 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar205;
                                  local_31c = -1;
                                  local_288.valid = &local_31c;
                                  local_288.geometryUserPtr = pGVar6->userPtr;
                                  local_288.context = context->user;
                                  local_288.ray = (RTCRayN *)ray;
                                  local_288.hit = (RTCHitN *)&local_188;
                                  local_288.N = 1;
                                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d31178:
                                    p_Var7 = context->args->filter;
                                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var7)(&local_288);
                                      auVar241 = ZEXT1664(local_318);
                                      auVar243 = ZEXT464(0x3f800000);
                                      auVar239 = ZEXT3264(_DAT_01feed20);
                                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar238 = ZEXT1664(auVar39);
                                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar237 = ZEXT1664(auVar39);
                                      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar236 = ZEXT3264(auVar62);
                                      auVar75._16_16_ = auVar62._16_16_;
                                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar235 = ZEXT1664(auVar39);
                                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar234 = ZEXT1664(auVar39);
                                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar244 = ZEXT1664(auVar39);
                                      if (*local_288.valid == 0) goto LAB_01d31291;
                                    }
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_288.hit;
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_288.hit + 4);
                                    (((Vec3f *)((long)local_288.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_288.hit + 8);
                                    *(float *)((long)local_288.ray + 0x3c) =
                                         *(float *)(local_288.hit + 0xc);
                                    *(float *)((long)local_288.ray + 0x40) =
                                         *(float *)(local_288.hit + 0x10);
                                    *(float *)((long)local_288.ray + 0x44) =
                                         *(float *)(local_288.hit + 0x14);
                                    *(float *)((long)local_288.ray + 0x48) =
                                         *(float *)(local_288.hit + 0x18);
                                    *(float *)((long)local_288.ray + 0x4c) =
                                         *(float *)(local_288.hit + 0x1c);
                                    *(float *)((long)local_288.ray + 0x50) =
                                         *(float *)(local_288.hit + 0x20);
                                  }
                                  else {
                                    (*pGVar6->intersectionFilterN)(&local_288);
                                    auVar241 = ZEXT1664(local_318);
                                    auVar243 = ZEXT464(0x3f800000);
                                    auVar239 = ZEXT3264(_DAT_01feed20);
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar238 = ZEXT1664(auVar39);
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar237 = ZEXT1664(auVar39);
                                    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar236 = ZEXT3264(auVar62);
                                    auVar75._16_16_ = auVar62._16_16_;
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar235 = ZEXT1664(auVar39);
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar234 = ZEXT1664(auVar39);
                                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar244 = ZEXT1664(auVar39);
                                    if (*local_288.valid != 0) goto LAB_01d31178;
LAB_01d31291:
                                    auVar243 = ZEXT464(0x3f800000);
                                    (ray->super_RayK<1>).tfar = fVar207;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
              }
            }
          }
          auVar240 = ZEXT1664(local_1c8);
          auVar242 = ZEXT1664(local_1d8);
          if ((uint)uVar27 == 0) break;
        } while( true );
      }
      fVar208 = (ray->super_RayK<1>).tfar;
      auVar17._4_4_ = fVar208;
      auVar17._0_4_ = fVar208;
      auVar17._8_4_ = fVar208;
      auVar17._12_4_ = fVar208;
      auVar17._16_4_ = fVar208;
      auVar17._20_4_ = fVar208;
      auVar17._24_4_ = fVar208;
      auVar17._28_4_ = fVar208;
      uVar10 = vcmpps_avx512vl(local_98,auVar17,2);
      uVar32 = (uint)uVar33 & (uint)uVar10;
      uVar33 = (ulong)uVar32;
    } while (uVar32 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }